

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O3

Matrix3d *
opengv::relative_pose::modules::eigensolver::composeMwithJacobians
          (Matrix3d *__return_storage_ptr__,Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,
          Matrix3d *yzF,Matrix3d *zxF,cayley_t *cayley,Matrix3d *M_jac1,Matrix3d *M_jac2,
          Matrix3d *M_jac3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  double dVar377;
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  double dVar405;
  double dVar406;
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  double dVar420;
  double dVar421;
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  double dVar459;
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  double dVar497;
  double dVar498;
  double dVar499;
  double dVar500;
  double dVar501;
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  double dVar526;
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  double dVar576;
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  double dVar610;
  double dVar611;
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  double dVar641;
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  double dVar644;
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  rotation_t R;
  double local_128;
  double local_98;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  math::cayley2rot_reduced(cayley);
  auVar407._8_8_ = 0;
  auVar407._0_8_ =
       (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
       [0];
  auVar502 = ZEXT816(0xc000000000000000);
  dVar1 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[2];
  auVar460._8_8_ = 0;
  auVar460._0_8_ = dVar1;
  dVar2 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1];
  auVar422._8_8_ = 0;
  auVar422._0_8_ = dVar2;
  auVar378._8_8_ = 0;
  auVar378._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar694._8_8_ = 0;
  auVar694._0_8_ = local_40;
  auVar378 = vmulsd_avx512f(auVar694,auVar378);
  auVar379 = vmulsd_avx512f(auVar407,auVar502);
  auVar380 = vaddsd_avx512f(auVar407,auVar407);
  auVar381 = vmulsd_avx512f(auVar460,auVar502);
  dVar1 = dVar1 + dVar1;
  dVar459 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1];
  auVar408._8_8_ = 0;
  auVar408._0_8_ = dVar459;
  dVar421 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2];
  auVar461._8_8_ = 0;
  auVar461._0_8_ = dVar421;
  auVar382 = vmulsd_avx512f(auVar422,auVar502);
  dVar2 = dVar2 + dVar2;
  dVar420 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  auVar423._8_8_ = 0;
  auVar423._0_8_ = dVar420;
  auVar701._8_8_ = 0;
  auVar701._0_8_ = local_38;
  auVar383 = vmulsd_avx512f(auVar701,auVar502);
  auVar678._8_8_ = 0;
  auVar678._0_8_ = local_50;
  auVar384 = vmulsd_avx512f(auVar678,auVar502);
  auVar385._8_8_ = 0;
  auVar385._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar385 = vmulsd_avx512f(auVar383,auVar385);
  auVar386._8_8_ = 0;
  auVar386._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar386 = vmulsd_avx512f(auVar383,auVar386);
  vmovsd_avx512f(auVar381);
  auVar387 = vmulsd_avx512f(auVar678,auVar408);
  auVar388 = vmulsd_avx512f(auVar701,auVar461);
  auVar673._8_8_ = 0;
  auVar673._0_8_ = local_68;
  auVar389 = vmulsd_avx512f(auVar673,auVar423);
  dVar526 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5];
  auVar577._8_8_ = 0;
  auVar577._0_8_ = dVar526;
  dVar405 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4];
  auVar553._8_8_ = 0;
  auVar553._0_8_ = dVar405;
  dVar406 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  auVar527._8_8_ = 0;
  auVar527._0_8_ = dVar406;
  auVar625._8_8_ = 0;
  auVar625._0_8_ = auVar389._0_8_ + auVar387._0_8_ + auVar388._0_8_;
  auVar390 = vmulsd_avx512f(auVar673,auVar625);
  auVar702._8_8_ = 0;
  auVar702._0_8_ = local_38;
  auVar387 = vmulsd_avx512f(auVar702,auVar577);
  auVar679._8_8_ = 0;
  auVar679._0_8_ = local_50;
  auVar388 = vmulsd_avx512f(auVar679,auVar553);
  auVar674._8_8_ = 0;
  auVar674._0_8_ = local_68;
  auVar389 = vmulsd_avx512f(auVar674,auVar527);
  dVar611 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8];
  auVar642._8_8_ = 0;
  auVar642._0_8_ = dVar611;
  dVar3 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [7];
  auVar612._8_8_ = 0;
  auVar612._0_8_ = dVar3;
  dVar4 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6];
  auVar595._8_8_ = 0;
  auVar595._0_8_ = dVar4;
  auVar643._8_8_ = 0;
  auVar643._0_8_ = auVar389._0_8_ + auVar388._0_8_ + auVar387._0_8_;
  auVar391 = vmulsd_avx512f(auVar679,auVar643);
  auVar387 = vmulsd_avx512f(auVar702,auVar642);
  auVar388 = vmulsd_avx512f(auVar679,auVar612);
  auVar389 = vmulsd_avx512f(auVar674,auVar595);
  auVar392 = vaddsd_avx512f(auVar388,auVar387);
  auVar387._8_8_ = 0;
  auVar387._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar387 = vmulsd_avx512f(auVar383,auVar387);
  auVar388._8_8_ = 0;
  auVar388._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar388 = vmulsd_avx512f(auVar384,auVar388);
  auVar645._8_8_ = 0;
  auVar645._0_8_ = auVar389._0_8_ + auVar392._0_8_;
  auVar393 = vmulsd_avx512f(auVar702,auVar645);
  auVar394 = vmulsd_avx512f(auVar674,auVar502);
  dVar610 = auVar394._0_8_;
  auVar392 = vaddsd_avx512f(auVar379,auVar379);
  auVar387 = vaddsd_avx512f(auVar388,auVar387);
  auVar389._8_8_ = 0;
  auVar389._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar388 = vmulsd_avx512f(auVar384,auVar389);
  dVar497 = auVar392._0_8_;
  auVar385 = vaddsd_avx512f(auVar388,auVar385);
  auVar392._8_8_ = 0;
  auVar392._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar388 = vmulsd_avx512f(auVar384,auVar392);
  auVar646._8_8_ = 0;
  auVar646._0_8_ =
       dVar610 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0] + auVar387._0_8_;
  auVar665._8_8_ = 0;
  auVar665._0_8_ = local_70;
  auVar387 = vmulsd_avx512f(auVar646,auVar665);
  auVar649._8_8_ = 0;
  auVar649._0_8_ =
       dVar610 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3];
  auVar385 = vaddsd_avx512f(auVar649,auVar385);
  auVar395._8_8_ = 0;
  auVar395._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar389 = vmulsd_avx512f(auVar394,auVar395);
  auVar386 = vaddsd_avx512f(auVar388,auVar386);
  auVar686._8_8_ = 0;
  auVar686._0_8_ = local_58;
  auVar385 = vmulsd_avx512f(auVar385,auVar686);
  auVar386 = vaddsd_avx512f(auVar389,auVar386);
  auVar394._8_8_ = 0;
  auVar394._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar388 = vmulsd_avx512f(auVar694,auVar394);
  auVar695._8_8_ = 0;
  auVar695._0_8_ = local_40;
  auVar386 = vmulsd_avx512f(auVar386,auVar695);
  auVar385 = vaddsd_avx512f(auVar385,auVar386);
  auVar396._8_8_ = 0;
  auVar396._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar386 = vmulsd_avx512f(auVar695,auVar396);
  auVar397._8_8_ = 0;
  auVar397._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar389 = vmulsd_avx512f(auVar686,auVar397);
  auVar398._8_8_ = 0;
  auVar398._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar392 = vmulsd_avx512f(auVar665,auVar398);
  auVar386 = vaddsd_avx512f(auVar389,auVar386);
  auVar399._8_8_ = 0;
  auVar399._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar687._8_8_ = 0;
  auVar687._0_8_ = local_58;
  auVar389 = vmulsd_avx512f(auVar687,auVar399);
  auVar400._8_8_ = 0;
  auVar400._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar666._8_8_ = 0;
  auVar666._0_8_ = local_70;
  auVar395 = vmulsd_avx512f(auVar666,auVar400);
  auVar647._8_8_ = 0;
  auVar647._0_8_ = auVar392._0_8_ + auVar386._0_8_;
  auVar386 = vmulsd_avx512f(auVar666,auVar647);
  auVar388 = vaddsd_avx512f(auVar389,auVar388);
  auVar401._8_8_ = 0;
  auVar401._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar389 = vmulsd_avx512f(auVar687,auVar401);
  auVar388 = vaddsd_avx512f(auVar395,auVar388);
  auVar402._8_8_ = 0;
  auVar402._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar392 = vmulsd_avx512f(auVar666,auVar402);
  auVar388 = vmulsd_avx512f(auVar687,auVar388);
  auVar378 = vaddsd_avx512f(auVar389,auVar378);
  auVar378 = vaddsd_avx512f(auVar392,auVar378);
  auVar378 = vmulsd_avx512f(auVar695,auVar378);
  auVar378 = vaddsd_avx512f(auVar388,auVar378);
  auVar388 = vaddsd_avx512f(auVar380,auVar380);
  dVar377 = dVar1 + dVar1;
  auVar551._8_8_ = 0;
  auVar551._0_8_ = dVar1;
  auVar389 = vmulsd_avx512f(auVar551,auVar502);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] =
       auVar390._0_8_ + auVar391._0_8_ + auVar393._0_8_ + auVar387._0_8_ + auVar385._0_8_ +
       auVar386._0_8_ + auVar378._0_8_;
  auVar378 = vmulsd_avx512f(auVar380,auVar502);
  auVar385 = vmulsd_avx512f(auVar379,auVar502);
  auVar409._8_8_ = 0;
  auVar409._0_8_ = dVar377 * dVar420 + dVar459 * 4.0 + dVar497 * dVar421;
  auVar386 = vmulsd_avx512f(auVar674,auVar409);
  dVar576 = auVar385._0_8_;
  auVar424._8_8_ = 0;
  auVar424._0_8_ = dVar377 * dVar406 + dVar405 * 4.0 + dVar497 * dVar526;
  auVar385 = vmulsd_avx512f(auVar679,auVar424);
  auVar462._8_8_ = 0;
  auVar462._0_8_ = dVar377 * dVar4 + dVar3 * 4.0 + dVar611 * dVar497;
  auVar387 = vmulsd_avx512f(auVar702,auVar462);
  dVar421 = auVar386._0_8_ + auVar385._0_8_ + auVar387._0_8_;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar421;
  dVar644 = auVar389._0_8_;
  auVar425._8_8_ = 0;
  auVar425._0_8_ =
       dVar644 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0] +
       (dVar576 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2] -
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
       * 4.0);
  auVar385 = vmulsd_avx512f(auVar666,auVar425);
  auVar463._8_8_ = 0;
  auVar463._0_8_ =
       dVar644 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3] +
       (dVar576 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] -
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
       * 4.0);
  auVar386 = vmulsd_avx512f(auVar687,auVar463);
  auVar528._8_8_ = 0;
  auVar528._0_8_ =
       dVar644 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[6] +
       (dVar576 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[8] -
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
       * 4.0);
  auVar387 = vmulsd_avx512f(auVar695,auVar528);
  dVar421 = dVar421 + auVar385._0_8_ + auVar386._0_8_ + auVar387._0_8_;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar421;
  auVar390._8_8_ = 0;
  auVar390._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar385 = vmulsd_avx512f(auVar384,auVar390);
  auVar391._8_8_ = 0;
  auVar391._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar386 = vmulsd_avx512f(auVar383,auVar391);
  auVar393._8_8_ = 0;
  auVar393._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar387 = vmulsd_avx512f(auVar383,auVar393);
  auVar403._8_8_ = 0;
  auVar403._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar389 = vmulsd_avx512f(auVar383,auVar403);
  auVar404._8_8_ = 0;
  auVar404._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar392 = vmulsd_avx512f(auVar384,auVar404);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7];
  auVar395 = vmulsd_avx512f(auVar384,auVar5);
  auVar464._8_8_ = 0;
  auVar464._0_8_ =
       dVar610 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3] + auVar392._0_8_ + auVar387._0_8_;
  auVar387 = vmulsd_avx512f(auVar379,auVar464);
  dVar4 = dVar2 + dVar2;
  dVar459 = dVar610 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[6] + auVar395._0_8_ + auVar389._0_8_;
  dVar421 = dVar421 + dVar2 * (dVar610 * (yzF->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         ).m_storage.m_data.array[0] +
                              auVar385._0_8_ + auVar386._0_8_) +
                      (auVar387._0_8_ - (dVar459 + dVar459));
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar421;
  auVar426._8_8_ = 0;
  auVar426._0_8_ =
       dVar4 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0] +
       (dVar497 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[1] -
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
       * 4.0);
  auVar667._8_8_ = 0;
  auVar667._0_8_ = local_70;
  auVar385 = vmulsd_avx512f(auVar667,auVar426);
  auVar386 = vaddsd_avx512f(auVar382,auVar382);
  dVar498 = auVar386._0_8_;
  auVar465._8_8_ = 0;
  auVar465._0_8_ =
       dVar4 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3] +
       (dVar497 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[4] -
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
       * 4.0);
  auVar688._8_8_ = 0;
  auVar688._0_8_ = local_58;
  auVar386 = vmulsd_avx512f(auVar688,auVar465);
  auVar529._8_8_ = 0;
  auVar529._0_8_ =
       dVar4 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6] +
       (dVar497 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[7] -
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
       * 4.0);
  auVar696._8_8_ = 0;
  auVar696._0_8_ = local_40;
  auVar387 = vmulsd_avx512f(auVar696,auVar529);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar421 + auVar385._0_8_ + auVar386._0_8_ + auVar387._0_8_;
  auVar385 = vmulsd_avx512f(auVar382,auVar502);
  dVar499 = auVar385._0_8_;
  auVar410._8_8_ = 0;
  auVar410._0_8_ =
       (dVar377 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[1] +
       dVar498 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2]) -
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       * 4.0;
  auVar675._8_8_ = 0;
  auVar675._0_8_ = local_68;
  auVar385 = vmulsd_avx512f(auVar675,auVar410);
  auVar427._8_8_ = 0;
  auVar427._0_8_ =
       (dVar377 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[4] +
       dVar498 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5]) -
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       * 4.0;
  auVar680._8_8_ = 0;
  auVar680._0_8_ = local_50;
  auVar386 = vmulsd_avx512f(auVar680,auVar427);
  auVar466._8_8_ = 0;
  auVar466._0_8_ =
       (dVar377 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[7] +
       dVar498 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8]) -
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       * 4.0;
  auVar703._8_8_ = 0;
  auVar703._0_8_ = local_38;
  auVar387 = vmulsd_avx512f(auVar703,auVar466);
  dVar459 = auVar385._0_8_ + auVar386._0_8_ + auVar387._0_8_;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar459;
  auVar624._8_8_ = 0;
  auVar624._0_8_ = dVar2;
  auVar385 = vmulsd_avx512f(auVar624,auVar502);
  dVar500 = auVar385._0_8_;
  auVar428._8_8_ = 0;
  auVar428._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       * 4.0 + dVar644 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[1] +
               dVar499 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[2];
  auVar385 = vmulsd_avx512f(auVar667,auVar428);
  auVar467._8_8_ = 0;
  auVar467._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       * 4.0 + dVar644 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4] +
               dVar499 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5];
  auVar386 = vmulsd_avx512f(auVar688,auVar467);
  auVar530._8_8_ = 0;
  auVar530._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       * 4.0 + dVar644 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[7] +
               dVar499 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8];
  auVar387 = vmulsd_avx512f(auVar696,auVar530);
  dVar459 = dVar459 + auVar385._0_8_ + auVar386._0_8_ + auVar387._0_8_;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar459;
  auVar502._8_8_ = 0;
  auVar502._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar385 = vmulsd_avx512f(auVar384,auVar502);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2];
  auVar386 = vmulsd_avx512f(auVar383,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5];
  auVar387 = vmulsd_avx512f(auVar383,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8];
  auVar389 = vmulsd_avx512f(auVar383,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4];
  auVar392 = vmulsd_avx512f(auVar384,auVar9);
  auVar429._8_8_ = 0;
  auVar429._0_8_ =
       dVar610 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0] + auVar385._0_8_ + auVar386._0_8_;
  auVar385 = vmulsd_avx512f(auVar380,auVar429);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar386 = vmulsd_avx512f(auVar384,auVar10);
  dVar459 = dVar459 + auVar385._0_8_ +
                      dVar2 * (dVar610 * (yzF->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         ).m_storage.m_data.array[3] +
                              auVar392._0_8_ + auVar387._0_8_) +
                      dVar1 * (dVar610 * (yzF->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         ).m_storage.m_data.array[6] +
                              auVar386._0_8_ + auVar389._0_8_);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar459;
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar385 = vmulsd_avx512f(auVar388,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar386 = vmulsd_avx512f(auVar388,auVar12);
  auVar430._8_8_ = 0;
  auVar430._0_8_ =
       auVar385._0_8_ +
       dVar4 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
       dVar377 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2];
  auVar385 = vmulsd_avx512f(auVar667,auVar430);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar387 = vmulsd_avx512f(auVar388,auVar13);
  auVar468._8_8_ = 0;
  auVar468._0_8_ =
       auVar386._0_8_ +
       dVar4 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
       dVar377 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5];
  auVar386 = vmulsd_avx512f(auVar688,auVar468);
  auVar531._8_8_ = 0;
  auVar531._0_8_ =
       auVar387._0_8_ +
       dVar4 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
       dVar377 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8];
  auVar387 = vmulsd_avx512f(auVar696,auVar531);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar459 + auVar385._0_8_ + auVar386._0_8_ + auVar387._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar385 = vmulsd_avx512f(auVar388,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar386 = vmulsd_avx512f(auVar388,auVar15);
  auVar411._8_8_ = 0;
  auVar411._0_8_ =
       auVar385._0_8_ +
       dVar4 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
       dVar377 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2];
  auVar385 = vmulsd_avx512f(auVar675,auVar411);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar387 = vmulsd_avx512f(auVar388,auVar16);
  auVar431._8_8_ = 0;
  auVar431._0_8_ =
       auVar386._0_8_ +
       dVar4 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
       dVar377 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5];
  auVar386 = vmulsd_avx512f(auVar680,auVar431);
  auVar469._8_8_ = 0;
  auVar469._0_8_ =
       auVar387._0_8_ +
       dVar4 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
       dVar377 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8];
  auVar387 = vmulsd_avx512f(auVar703,auVar469);
  dVar421 = auVar385._0_8_ + auVar386._0_8_ + auVar387._0_8_;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar421;
  dVar641 = auVar378._0_8_;
  auVar432._8_8_ = 0;
  auVar432._0_8_ =
       dVar641 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0] +
       dVar500 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] +
       dVar644 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2];
  auVar378 = vmulsd_avx512f(auVar667,auVar432);
  auVar385 = vaddsd_avx512f(auVar381,auVar381);
  auVar470._8_8_ = 0;
  auVar470._0_8_ =
       dVar641 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3] +
       dVar500 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4] +
       dVar644 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5];
  auVar386 = vmulsd_avx512f(auVar688,auVar470);
  dVar501 = auVar385._0_8_;
  auVar532._8_8_ = 0;
  auVar532._0_8_ =
       dVar641 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[6] +
       dVar500 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] +
       dVar644 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8];
  auVar385 = vmulsd_avx512f(auVar696,auVar532);
  dVar421 = dVar421 + auVar378._0_8_ + auVar386._0_8_ + auVar385._0_8_;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar421;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vmulsd_avx512f(auVar384,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar385 = vmulsd_avx512f(auVar383,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar386 = vmulsd_avx512f(auVar383,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar387 = vmulsd_avx512f(auVar383,auVar20);
  auVar383._8_8_ = 0;
  auVar383._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar389 = vmulsd_avx512f(auVar384,auVar383);
  dVar459 = dVar610 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0] + auVar378._0_8_ + auVar385._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar378 = vmulsd_avx512f(auVar384,auVar21);
  auVar471._8_8_ = 0;
  auVar471._0_8_ =
       dVar610 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3] + auVar389._0_8_ + auVar386._0_8_;
  auVar385 = vmulsd_avx512f(auVar381,auVar471);
  dVar421 = dVar421 + dVar459 + dVar459 +
                      auVar385._0_8_ +
                      dVar2 * (dVar610 * (yzF->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         ).m_storage.m_data.array[6] +
                              auVar378._0_8_ + auVar387._0_8_);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar421;
  auVar433._8_8_ = 0;
  auVar433._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       * 4.0 + dVar501 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[1] +
               dVar4 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[2];
  auVar378 = vmulsd_avx512f(auVar667,auVar433);
  auVar472._8_8_ = 0;
  auVar472._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       * 4.0 + dVar501 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4] +
               dVar4 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5];
  auVar385 = vmulsd_avx512f(auVar688,auVar472);
  auVar533._8_8_ = 0;
  auVar533._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       * 4.0 + dVar501 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[7] +
               dVar4 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[8];
  auVar386 = vmulsd_avx512f(auVar696,auVar533);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar421 + auVar378._0_8_ + auVar385._0_8_ + auVar386._0_8_;
  dVar459 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1];
  auVar613._8_8_ = 0;
  auVar613._0_8_ = dVar459;
  dVar421 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2];
  auVar596._8_8_ = 0;
  auVar596._0_8_ = dVar421;
  dVar420 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4];
  auVar578._8_8_ = 0;
  auVar578._0_8_ = dVar420;
  dVar526 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5];
  auVar554._8_8_ = 0;
  auVar554._0_8_ = dVar526;
  dVar405 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  auVar534._8_8_ = 0;
  auVar534._0_8_ = dVar405;
  dVar406 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7];
  auVar503._8_8_ = 0;
  auVar503._0_8_ = dVar406;
  auVar381._8_8_ = 0;
  auVar381._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vmulsd_avx512f(auVar680,auVar381);
  auVar385 = vmulsd_avx512f(auVar680,auVar613);
  auVar386 = vmulsd_avx512f(auVar703,auVar596);
  auVar658._8_8_ = 0;
  auVar658._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar387 = vmulsd_avx512f(auVar675,auVar658);
  dVar611 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8];
  auVar473._8_8_ = 0;
  auVar473._0_8_ = dVar611;
  auVar434._8_8_ = 0;
  auVar434._0_8_ = auVar385._0_8_ + auVar386._0_8_;
  auVar385 = vaddsd_avx512f(auVar387,auVar434);
  auVar386 = vmulsd_avx512f(auVar680,auVar578);
  auVar387 = vmulsd_avx512f(auVar703,auVar554);
  auVar389 = vmulsd_avx512f(auVar675,auVar534);
  auVar392 = vmulsd_avx512f(auVar703,auVar473);
  auVar412._8_8_ = 0;
  auVar412._0_8_ = auVar386._0_8_ + auVar387._0_8_;
  auVar386 = vaddsd_avx512f(auVar389,auVar412);
  dVar3 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6];
  auVar435._8_8_ = 0;
  auVar435._0_8_ = dVar3;
  auVar387 = vmulsd_avx512f(auVar680,auVar503);
  auVar387 = vaddsd_avx512f(auVar387,auVar392);
  auVar413._8_8_ = 0x8000000000000000;
  auVar413._0_8_ = 0x8000000000000000;
  auVar389 = vmulsd_avx512f(auVar675,auVar435);
  auVar387 = vaddsd_avx512f(auVar389,auVar387);
  auVar709._8_8_ = 0;
  auVar709._0_8_ = local_60;
  auVar386 = vmulsd_avx512f(auVar386,auVar709);
  auVar712._8_8_ = 0;
  auVar712._0_8_ = local_48;
  auVar387 = vmulsd_avx512f(auVar387,auVar712);
  auVar386 = vaddsd_avx512f(auVar386,auVar387);
  auVar715._8_8_ = 0;
  auVar715._0_8_ = local_78;
  auVar385 = vmulsd_avx512f(auVar385,auVar715);
  auVar385 = vaddsd_avx512f(auVar385,auVar386);
  auVar386 = vxorpd_avx512vl(auVar703,auVar413);
  auVar384._8_8_ = 0;
  auVar384._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar387 = vmulsd_avx512f(auVar386,auVar384);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar389 = vmulsd_avx512f(auVar680,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar392 = vmulsd_avx512f(auVar675,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar395 = vmulsd_avx512f(auVar386,auVar24);
  auVar414._8_8_ = 0;
  auVar414._0_8_ = (auVar387._0_8_ - auVar378._0_8_) - auVar392._0_8_;
  auVar378 = vmulsd_avx512f(auVar675,auVar414);
  auVar387 = vsubsd_avx512f(auVar395,auVar389);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar389 = vmulsd_avx512f(auVar675,auVar25);
  auVar387 = vsubsd_avx512f(auVar387,auVar389);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar389 = vmulsd_avx512f(auVar386,auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar392 = vmulsd_avx512f(auVar680,auVar27);
  auVar681._8_8_ = 0;
  auVar681._0_8_ = local_50;
  auVar387 = vmulsd_avx512f(auVar681,auVar387);
  auVar389 = vsubsd_avx512f(auVar389,auVar392);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar676._8_8_ = 0;
  auVar676._0_8_ = local_68;
  auVar392 = vmulsd_avx512f(auVar676,auVar28);
  auVar389 = vsubsd_avx512f(auVar389,auVar392);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar392 = vmulsd_avx512f(auVar688,auVar29);
  auVar389 = vmulsd_avx512f(auVar703,auVar389);
  auVar387 = vaddsd_avx512f(auVar387,auVar389);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar389 = vmulsd_avx512f(auVar688,auVar30);
  auVar415._8_8_ = 0;
  auVar415._0_8_ = auVar387._0_8_ + auVar378._0_8_;
  auVar378 = vaddsd_avx512f(auVar385,auVar415);
  auVar385 = vxorpd_avx512vl(auVar696,auVar413);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar387 = vmulsd_avx512f(auVar385,auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar395 = vmulsd_avx512f(auVar688,auVar32);
  auVar387 = vsubsd_avx512f(auVar387,auVar389);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar389 = vmulsd_avx512f(auVar667,auVar33);
  auVar387 = vsubsd_avx512f(auVar387,auVar389);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar389 = vmulsd_avx512f(auVar385,auVar34);
  auVar387 = vmulsd_avx512f(auVar715,auVar387);
  auVar389 = vsubsd_avx512f(auVar389,auVar392);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar392 = vmulsd_avx512f(auVar667,auVar35);
  auVar389 = vsubsd_avx512f(auVar389,auVar392);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar392 = vmulsd_avx512f(auVar385,auVar36);
  auVar389 = vmulsd_avx512f(auVar709,auVar389);
  auVar392 = vsubsd_avx512f(auVar392,auVar395);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar395 = vmulsd_avx512f(auVar667,auVar37);
  auVar392 = vsubsd_avx512f(auVar392,auVar395);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar395 = vmulsd_avx512f(auVar696,auVar38);
  auVar392 = vmulsd_avx512f(auVar712,auVar392);
  auVar389 = vaddsd_avx512f(auVar389,auVar392);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar392 = vmulsd_avx512f(auVar696,auVar39);
  auVar387 = vaddsd_avx512f(auVar387,auVar389);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar697._8_8_ = 0;
  auVar697._0_8_ = local_40;
  auVar389 = vmulsd_avx512f(auVar697,auVar40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar689._8_8_ = 0;
  auVar689._0_8_ = local_58;
  auVar394 = vmulsd_avx512f(auVar689,auVar41);
  auVar389 = vaddsd_avx512f(auVar394,auVar389);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar668._8_8_ = 0;
  auVar668._0_8_ = local_70;
  auVar394 = vmulsd_avx512f(auVar668,auVar42);
  auVar389 = vaddsd_avx512f(auVar394,auVar389);
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar394 = vmulsd_avx512f(auVar689,auVar43);
  auVar389 = vmulsd_avx512f(auVar676,auVar389);
  auVar392 = vaddsd_avx512f(auVar394,auVar392);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar394 = vmulsd_avx512f(auVar668,auVar44);
  auVar392 = vaddsd_avx512f(auVar394,auVar392);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar394 = vmulsd_avx512f(auVar689,auVar45);
  auVar392 = vmulsd_avx512f(auVar681,auVar392);
  auVar395 = vaddsd_avx512f(auVar394,auVar395);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar394 = vmulsd_avx512f(auVar668,auVar46);
  auVar395 = vaddsd_avx512f(auVar394,auVar395);
  auVar395 = vmulsd_avx512f(auVar703,auVar395);
  auVar392 = vaddsd_avx512f(auVar392,auVar395);
  auVar389 = vaddsd_avx512f(auVar389,auVar392);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = auVar389._0_8_ + auVar387._0_8_ + auVar378._0_8_;
  auVar378 = vxorpd_avx512vl(auVar551,auVar413);
  dVar610 = auVar379._0_8_;
  auVar387 = vmulsd_avx512f(auVar551,auVar658);
  auVar535._8_8_ = 0;
  auVar535._0_8_ = dVar1 * dVar405 + dVar420 + dVar420 + dVar610 * dVar526;
  auVar710._8_8_ = 0;
  auVar710._0_8_ = local_60;
  auVar389 = vmulsd_avx512f(auVar535,auVar710);
  auVar436._8_8_ = 0;
  auVar436._0_8_ = dVar1 * dVar3 + dVar406 + dVar406 + dVar610 * dVar611;
  auVar713._8_8_ = 0;
  auVar713._0_8_ = local_48;
  auVar392 = vmulsd_avx512f(auVar436,auVar713);
  auVar416._8_8_ = 0;
  auVar416._0_8_ = auVar387._0_8_ + dVar610 * dVar421 + dVar459 + dVar459;
  auVar716._8_8_ = 0;
  auVar716._0_8_ = local_78;
  auVar387 = vmulsd_avx512f(auVar416,auVar716);
  dVar420 = auVar387._0_8_ + auVar389._0_8_ + auVar392._0_8_;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar420;
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar387 = vmulsd_avx512f(auVar681,auVar47);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar704._8_8_ = 0;
  auVar704._0_8_ = local_38;
  auVar389 = vmulsd_avx512f(auVar704,auVar48);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar392 = vmulsd_avx512f(auVar704,auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar395 = vmulsd_avx512f(auVar704,auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar394 = vmulsd_avx512f(auVar676,auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar396 = vmulsd_avx512f(auVar681,auVar52);
  auVar437._8_8_ = 0;
  auVar437._0_8_ = auVar394._0_8_ + auVar387._0_8_ + auVar389._0_8_;
  auVar387 = vmulsd_avx512f(auVar380,auVar437);
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar389 = vmulsd_avx512f(auVar676,auVar53);
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar394 = vmulsd_avx512f(auVar681,auVar54);
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar397 = vmulsd_avx512f(auVar676,auVar55);
  dVar420 = dVar420 + auVar387._0_8_ +
                      dVar2 * (auVar389._0_8_ + auVar396._0_8_ + auVar392._0_8_) +
                      dVar1 * (auVar397._0_8_ + auVar394._0_8_ + auVar395._0_8_);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar420;
  auVar438._8_8_ = 0;
  auVar438._0_8_ =
       dVar644 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0] +
       (dVar576 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2] -
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
       * 4.0);
  auVar387 = vmulsd_avx512f(auVar676,auVar438);
  auVar474._8_8_ = 0;
  auVar474._0_8_ =
       dVar644 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3] +
       (dVar576 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] -
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
       * 4.0);
  auVar389 = vmulsd_avx512f(auVar681,auVar474);
  auVar504._8_8_ = 0;
  auVar504._0_8_ =
       dVar644 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[6] +
       (dVar576 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[8] -
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
       * 4.0);
  auVar392 = vmulsd_avx512f(auVar704,auVar504);
  dVar420 = dVar420 + auVar387._0_8_ + auVar389._0_8_ + auVar392._0_8_;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar420;
  dVar459 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2];
  dVar421 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5];
  auVar439._8_8_ = 0;
  auVar439._0_8_ =
       ((dVar459 + dVar459) -
       dVar610 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1]) -
       dVar2 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0];
  auVar387 = vmulsd_avx512f(auVar716,auVar439);
  dVar459 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8];
  auVar475._8_8_ = 0;
  auVar475._0_8_ =
       ((dVar421 + dVar421) -
       dVar610 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4]) -
       dVar2 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3];
  auVar389 = vmulsd_avx512f(auVar710,auVar475);
  auVar505._8_8_ = 0;
  auVar505._0_8_ =
       ((dVar459 + dVar459) -
       dVar610 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7]) -
       dVar2 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6];
  auVar392 = vmulsd_avx512f(auVar713,auVar505);
  dVar420 = dVar420 + auVar387._0_8_ + auVar389._0_8_ + auVar392._0_8_;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar420;
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar387 = vmulsd_avx512f(auVar385,auVar56);
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar389 = vmulsd_avx512f(auVar689,auVar57);
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar392 = vmulsd_avx512f(auVar689,auVar58);
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar395 = vmulsd_avx512f(auVar689,auVar59);
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar394 = vmulsd_avx512f(auVar668,auVar60);
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar396 = vmulsd_avx512f(auVar385,auVar61);
  auVar440._8_8_ = 0;
  auVar440._0_8_ = (auVar387._0_8_ - auVar389._0_8_) - auVar394._0_8_;
  auVar387 = vmulsd_avx512f(auVar380,auVar440);
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar389 = vmulsd_avx512f(auVar668,auVar62);
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar394 = vmulsd_avx512f(auVar385,auVar63);
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar397 = vmulsd_avx512f(auVar668,auVar64);
  dVar420 = dVar420 + auVar387._0_8_ +
                      dVar2 * ((auVar396._0_8_ - auVar392._0_8_) - auVar389._0_8_) +
                      dVar1 * ((auVar394._0_8_ - auVar395._0_8_) - auVar397._0_8_);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar420;
  dVar459 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2];
  dVar421 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5];
  auVar441._8_8_ = 0;
  auVar441._0_8_ =
       dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0] +
       (dVar610 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[1] - (dVar459 + dVar459));
  auVar387 = vmulsd_avx512f(auVar676,auVar441);
  dVar459 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8];
  auVar476._8_8_ = 0;
  auVar476._0_8_ =
       dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3] +
       (dVar610 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[4] - (dVar421 + dVar421));
  auVar389 = vmulsd_avx512f(auVar681,auVar476);
  auVar506._8_8_ = 0;
  auVar506._0_8_ =
       dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6] +
       (dVar610 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[7] - (dVar459 + dVar459));
  auVar392 = vmulsd_avx512f(auVar704,auVar506);
  dVar420 = dVar420 + auVar387._0_8_ + auVar389._0_8_ + auVar392._0_8_;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar420;
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar387 = vmulsd_avx512f(auVar689,auVar65);
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar389 = vmulsd_avx512f(auVar697,auVar66);
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar392 = vmulsd_avx512f(auVar697,auVar67);
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar395 = vmulsd_avx512f(auVar697,auVar68);
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar394 = vmulsd_avx512f(auVar668,auVar69);
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar396 = vmulsd_avx512f(auVar689,auVar70);
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar397 = vmulsd_avx512f(auVar668,auVar71);
  dVar459 = auVar397._0_8_ + auVar396._0_8_ + auVar392._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar392 = vmulsd_avx512f(auVar689,auVar72);
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar396 = vmulsd_avx512f(auVar668,auVar73);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar420 + dVar1 * (auVar394._0_8_ + auVar387._0_8_ + auVar389._0_8_) +
                 dVar459 + dVar459 + dVar610 * (auVar396._0_8_ + auVar392._0_8_ + auVar395._0_8_);
  dVar405 = auVar382._0_8_;
  dVar459 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  auVar417._8_8_ = 0;
  auVar417._0_8_ =
       (dVar1 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[1] +
       dVar405 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2]) - (dVar459 + dVar459);
  auVar387 = vmulsd_avx512f(auVar716,auVar417);
  dVar459 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  auVar442._8_8_ = 0;
  auVar442._0_8_ =
       (dVar1 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[4] +
       dVar405 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5]) - (dVar459 + dVar459);
  auVar389 = vmulsd_avx512f(auVar710,auVar442);
  dVar459 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6];
  auVar477._8_8_ = 0;
  auVar477._0_8_ =
       (dVar1 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[7] +
       dVar405 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8]) - (dVar459 + dVar459);
  auVar392 = vmulsd_avx512f(auVar713,auVar477);
  dVar421 = auVar387._0_8_ + auVar389._0_8_ + auVar392._0_8_;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar421;
  auVar74._8_8_ = 0;
  auVar74._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar387 = vmulsd_avx512f(auVar681,auVar74);
  auVar75._8_8_ = 0;
  auVar75._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar389 = vmulsd_avx512f(auVar704,auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar392 = vmulsd_avx512f(auVar704,auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar395 = vmulsd_avx512f(auVar704,auVar77);
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar394 = vmulsd_avx512f(auVar676,auVar78);
  auVar79._8_8_ = 0;
  auVar79._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar396 = vmulsd_avx512f(auVar681,auVar79);
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar397 = vmulsd_avx512f(auVar676,auVar80);
  auVar81._8_8_ = 0;
  auVar81._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar398 = vmulsd_avx512f(auVar681,auVar81);
  auVar478._8_8_ = 0;
  auVar478._0_8_ = auVar397._0_8_ + auVar396._0_8_ + auVar392._0_8_;
  auVar392 = vmulsd_avx512f(auVar380,auVar478);
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar396 = vmulsd_avx512f(auVar676,auVar82);
  dVar459 = auVar396._0_8_ + auVar398._0_8_ + auVar395._0_8_;
  dVar421 = dVar421 + dVar405 * (auVar394._0_8_ + auVar387._0_8_ + auVar389._0_8_) +
                      auVar392._0_8_ + dVar459 + dVar459;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar421;
  auVar443._8_8_ = 0;
  auVar443._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       * 4.0 + dVar644 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[1] +
               dVar499 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[2];
  auVar387 = vmulsd_avx512f(auVar676,auVar443);
  auVar479._8_8_ = 0;
  auVar479._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       * 4.0 + dVar644 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4] +
               dVar499 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5];
  auVar389 = vmulsd_avx512f(auVar681,auVar479);
  auVar507._8_8_ = 0;
  auVar507._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       * 4.0 + dVar644 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[7] +
               dVar499 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8];
  auVar392 = vmulsd_avx512f(auVar704,auVar507);
  dVar421 = dVar421 + auVar387._0_8_ + auVar389._0_8_ + auVar392._0_8_;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar421;
  auVar83._8_8_ = 0;
  auVar83._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar387 = vmulsd_avx512f(auVar378,auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar389 = vmulsd_avx512f(auVar380,auVar84);
  auVar85._8_8_ = 0;
  auVar85._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar392 = vmulsd_avx512f(auVar378,auVar85);
  auVar444._8_8_ = 0;
  auVar444._0_8_ =
       (auVar387._0_8_ -
       dVar2 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1]) - auVar389._0_8_;
  auVar387 = vmulsd_avx512f(auVar716,auVar444);
  auVar86._8_8_ = 0;
  auVar86._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar389 = vmulsd_avx512f(auVar380,auVar86);
  auVar87._8_8_ = 0;
  auVar87._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar395 = vmulsd_avx512f(auVar378,auVar87);
  auVar480._8_8_ = 0;
  auVar480._0_8_ =
       (auVar392._0_8_ -
       dVar2 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4]) - auVar389._0_8_;
  auVar389 = vmulsd_avx512f(auVar710,auVar480);
  auVar88._8_8_ = 0;
  auVar88._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar392 = vmulsd_avx512f(auVar380,auVar88);
  auVar508._8_8_ = 0;
  auVar508._0_8_ =
       (auVar395._0_8_ -
       dVar2 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7]) - auVar392._0_8_;
  auVar392 = vmulsd_avx512f(auVar713,auVar508);
  dVar421 = dVar421 + auVar387._0_8_ + auVar389._0_8_ + auVar392._0_8_;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar421;
  auVar89._8_8_ = 0;
  auVar89._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar387 = vmulsd_avx512f(auVar385,auVar89);
  auVar90._8_8_ = 0;
  auVar90._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar389 = vmulsd_avx512f(auVar689,auVar90);
  auVar91._8_8_ = 0;
  auVar91._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar392 = vmulsd_avx512f(auVar689,auVar91);
  auVar92._8_8_ = 0;
  auVar92._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar395 = vmulsd_avx512f(auVar689,auVar92);
  auVar93._8_8_ = 0;
  auVar93._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar394 = vmulsd_avx512f(auVar668,auVar93);
  auVar94._8_8_ = 0;
  auVar94._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar396 = vmulsd_avx512f(auVar385,auVar94);
  auVar95._8_8_ = 0;
  auVar95._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar397 = vmulsd_avx512f(auVar668,auVar95);
  auVar96._8_8_ = 0;
  auVar96._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar398 = vmulsd_avx512f(auVar385,auVar96);
  auVar481._8_8_ = 0;
  auVar481._0_8_ = (auVar396._0_8_ - auVar392._0_8_) - auVar397._0_8_;
  auVar392 = vmulsd_avx512f(auVar380,auVar481);
  auVar97._8_8_ = 0;
  auVar97._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar396 = vmulsd_avx512f(auVar668,auVar97);
  dVar459 = (auVar398._0_8_ - auVar395._0_8_) - auVar396._0_8_;
  dVar421 = dVar421 + dVar405 * ((auVar387._0_8_ - auVar389._0_8_) - auVar394._0_8_) +
                      auVar392._0_8_ + dVar459 + dVar459;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar421;
  auVar98._8_8_ = 0;
  auVar98._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar387 = vmulsd_avx512f(auVar380,auVar98);
  auVar445._8_8_ = 0;
  auVar445._0_8_ =
       auVar387._0_8_ +
       dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
       dVar1 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2];
  auVar387 = vmulsd_avx512f(auVar676,auVar445);
  auVar99._8_8_ = 0;
  auVar99._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar389 = vmulsd_avx512f(auVar380,auVar99);
  auVar482._8_8_ = 0;
  auVar482._0_8_ =
       auVar389._0_8_ +
       dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
       dVar1 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5];
  auVar389 = vmulsd_avx512f(auVar681,auVar482);
  auVar100._8_8_ = 0;
  auVar100._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar392 = vmulsd_avx512f(auVar380,auVar100);
  auVar509._8_8_ = 0;
  auVar509._0_8_ =
       auVar392._0_8_ +
       dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
       dVar1 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8];
  auVar392 = vmulsd_avx512f(auVar704,auVar509);
  dVar421 = dVar421 + auVar387._0_8_ + auVar389._0_8_ + auVar392._0_8_;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar421;
  auVar101._8_8_ = 0;
  auVar101._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar387 = vmulsd_avx512f(auVar689,auVar101);
  auVar102._8_8_ = 0;
  auVar102._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar389 = vmulsd_avx512f(auVar697,auVar102);
  auVar103._8_8_ = 0;
  auVar103._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar392 = vmulsd_avx512f(auVar697,auVar103);
  auVar104._8_8_ = 0;
  auVar104._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar395 = vmulsd_avx512f(auVar697,auVar104);
  auVar105._8_8_ = 0;
  auVar105._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar394 = vmulsd_avx512f(auVar668,auVar105);
  dVar459 = auVar394._0_8_ + auVar387._0_8_ + auVar389._0_8_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar387 = vmulsd_avx512f(auVar689,auVar106);
  auVar107._8_8_ = 0;
  auVar107._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar389 = vmulsd_avx512f(auVar668,auVar107);
  auVar108._8_8_ = 0;
  auVar108._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar394 = vmulsd_avx512f(auVar689,auVar108);
  auVar109._8_8_ = 0;
  auVar109._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar396 = vmulsd_avx512f(auVar668,auVar109);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar421 + ((dVar1 * (auVar389._0_8_ + auVar387._0_8_ + auVar392._0_8_) +
                  dVar405 * (auVar396._0_8_ + auVar394._0_8_ + auVar395._0_8_)) -
                 (dVar459 + dVar459));
  auVar110._8_8_ = 0;
  auVar110._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar387 = vmulsd_avx512f(auVar380,auVar110);
  auVar418._8_8_ = 0;
  auVar418._0_8_ =
       auVar387._0_8_ +
       dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
       dVar1 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2];
  auVar717._8_8_ = 0;
  auVar717._0_8_ = local_78;
  auVar387 = vmulsd_avx512f(auVar717,auVar418);
  auVar111._8_8_ = 0;
  auVar111._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar389 = vmulsd_avx512f(auVar380,auVar111);
  auVar446._8_8_ = 0;
  auVar446._0_8_ =
       auVar389._0_8_ +
       dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
       dVar1 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5];
  auVar711._8_8_ = 0;
  auVar711._0_8_ = local_60;
  auVar389 = vmulsd_avx512f(auVar711,auVar446);
  auVar112._8_8_ = 0;
  auVar112._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar392 = vmulsd_avx512f(auVar380,auVar112);
  auVar483._8_8_ = 0;
  auVar483._0_8_ =
       auVar392._0_8_ +
       dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
       dVar1 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8];
  auVar714._8_8_ = 0;
  auVar714._0_8_ = local_48;
  auVar392 = vmulsd_avx512f(auVar714,auVar483);
  dVar421 = auVar387._0_8_ + auVar389._0_8_ + auVar392._0_8_;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar421;
  auVar113._8_8_ = 0;
  auVar113._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar387 = vmulsd_avx512f(auVar681,auVar113);
  auVar114._8_8_ = 0;
  auVar114._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar389 = vmulsd_avx512f(auVar704,auVar114);
  auVar115._8_8_ = 0;
  auVar115._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar392 = vmulsd_avx512f(auVar704,auVar115);
  auVar116._8_8_ = 0;
  auVar116._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar395 = vmulsd_avx512f(auVar704,auVar116);
  auVar117._8_8_ = 0;
  auVar117._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar394 = vmulsd_avx512f(auVar676,auVar117);
  auVar118._8_8_ = 0;
  auVar118._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar396 = vmulsd_avx512f(auVar681,auVar118);
  auVar447._8_8_ = 0;
  auVar447._0_8_ = auVar394._0_8_ + auVar387._0_8_ + auVar389._0_8_;
  auVar659._8_8_ = 0;
  auVar659._0_8_ = local_128;
  auVar387 = vmulsd_avx512f(auVar659,auVar447);
  auVar119._8_8_ = 0;
  auVar119._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar389 = vmulsd_avx512f(auVar676,auVar119);
  dVar459 = auVar389._0_8_ + auVar396._0_8_ + auVar392._0_8_;
  auVar120._8_8_ = 0;
  auVar120._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar389 = vmulsd_avx512f(auVar681,auVar120);
  auVar121._8_8_ = 0;
  auVar121._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar392 = vmulsd_avx512f(auVar676,auVar121);
  auVar510._8_8_ = 0;
  auVar510._0_8_ = auVar392._0_8_ + auVar389._0_8_ + auVar395._0_8_;
  auVar389 = vmulsd_avx512f(auVar380,auVar510);
  dVar421 = dVar421 + auVar387._0_8_ + (auVar389._0_8_ - (dVar459 + dVar459));
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar421;
  auVar122._8_8_ = 0;
  auVar122._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar654._8_8_ = 0;
  auVar654._0_8_ = dVar500;
  auVar387 = vmulsd_avx512f(auVar654,auVar122);
  auVar123._8_8_ = 0;
  auVar123._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar389 = vmulsd_avx512f(auVar654,auVar123);
  auVar448._8_8_ = 0;
  auVar448._0_8_ =
       dVar641 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0] +
       auVar387._0_8_ +
       dVar644 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2];
  auVar387 = vmulsd_avx512f(auVar676,auVar448);
  auVar124._8_8_ = 0;
  auVar124._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar655._8_8_ = 0;
  auVar655._0_8_ = dVar500;
  auVar392 = vmulsd_avx512f(auVar655,auVar124);
  auVar484._8_8_ = 0;
  auVar484._0_8_ =
       dVar641 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3] +
       auVar389._0_8_ +
       dVar644 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5];
  auVar389 = vmulsd_avx512f(auVar681,auVar484);
  auVar511._8_8_ = 0;
  auVar511._0_8_ =
       dVar641 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[6] +
       auVar392._0_8_ +
       dVar644 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8];
  auVar392 = vmulsd_avx512f(auVar704,auVar511);
  dVar421 = dVar421 + auVar387._0_8_ + auVar389._0_8_ + auVar392._0_8_;
  auVar387 = vxorpd_avx512vl(auVar624,auVar413);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar421;
  dVar420 = auVar387._0_8_;
  auVar125._8_8_ = 0;
  auVar125._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar387 = vmulsd_avx512f(auVar659,auVar125);
  auVar126._8_8_ = 0;
  auVar126._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar660._8_8_ = 0;
  auVar660._0_8_ = local_128;
  auVar389 = vmulsd_avx512f(auVar660,auVar126);
  dVar459 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  auVar485._8_8_ = 0;
  auVar485._0_8_ =
       (dVar420 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2] - auVar387._0_8_) - (dVar459 + dVar459);
  auVar387 = vmulsd_avx512f(auVar717,auVar485);
  dVar459 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  auVar127._8_8_ = 0;
  auVar127._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar392 = vmulsd_avx512f(auVar660,auVar127);
  auVar512._8_8_ = 0;
  auVar512._0_8_ =
       (dVar420 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] - auVar389._0_8_) - (dVar459 + dVar459);
  auVar389 = vmulsd_avx512f(auVar711,auVar512);
  dVar459 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6];
  auVar449._8_8_ = 0;
  auVar449._0_8_ =
       (dVar420 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[8] - auVar392._0_8_) - (dVar459 + dVar459);
  auVar392 = vmulsd_avx512f(auVar714,auVar449);
  dVar421 = dVar421 + auVar387._0_8_ + auVar389._0_8_ + auVar392._0_8_;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar421;
  auVar128._8_8_ = 0;
  auVar128._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar387 = vmulsd_avx512f(auVar385,auVar128);
  auVar129._8_8_ = 0;
  auVar129._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar389 = vmulsd_avx512f(auVar689,auVar129);
  auVar130._8_8_ = 0;
  auVar130._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar690._8_8_ = 0;
  auVar690._0_8_ = local_58;
  auVar392 = vmulsd_avx512f(auVar690,auVar130);
  auVar131._8_8_ = 0;
  auVar131._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar395 = vmulsd_avx512f(auVar690,auVar131);
  auVar132._8_8_ = 0;
  auVar132._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar394 = vmulsd_avx512f(auVar668,auVar132);
  auVar133._8_8_ = 0;
  auVar133._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar396 = vmulsd_avx512f(auVar385,auVar133);
  auVar450._8_8_ = 0;
  auVar450._0_8_ = (auVar387._0_8_ - auVar389._0_8_) - auVar394._0_8_;
  auVar387 = vmulsd_avx512f(auVar660,auVar450);
  auVar134._8_8_ = 0;
  auVar134._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar669._8_8_ = 0;
  auVar669._0_8_ = local_70;
  auVar389 = vmulsd_avx512f(auVar669,auVar134);
  dVar459 = (auVar396._0_8_ - auVar392._0_8_) - auVar389._0_8_;
  auVar135._8_8_ = 0;
  auVar135._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar389 = vmulsd_avx512f(auVar385,auVar135);
  auVar136._8_8_ = 0;
  auVar136._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar392 = vmulsd_avx512f(auVar669,auVar136);
  auVar513._8_8_ = 0;
  auVar513._0_8_ = (auVar389._0_8_ - auVar395._0_8_) - auVar392._0_8_;
  auVar389 = vmulsd_avx512f(auVar380,auVar513);
  dVar421 = dVar421 + auVar387._0_8_ + (auVar389._0_8_ - (dVar459 + dVar459));
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar421;
  auVar137._8_8_ = 0;
  auVar137._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar387 = vmulsd_avx512f(auVar660,auVar137);
  dVar459 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  auVar138._8_8_ = 0;
  auVar138._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar661._8_8_ = 0;
  auVar661._0_8_ = local_128;
  auVar389 = vmulsd_avx512f(auVar661,auVar138);
  auVar451._8_8_ = 0;
  auVar451._0_8_ =
       dVar459 + dVar459 +
       auVar387._0_8_ +
       dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2];
  auVar677._8_8_ = 0;
  auVar677._0_8_ = local_68;
  auVar387 = vmulsd_avx512f(auVar677,auVar451);
  dVar459 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  auVar139._8_8_ = 0;
  auVar139._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar392 = vmulsd_avx512f(auVar661,auVar139);
  auVar486._8_8_ = 0;
  auVar486._0_8_ =
       dVar459 + dVar459 +
       auVar389._0_8_ +
       dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5];
  auVar682._8_8_ = 0;
  auVar682._0_8_ = local_50;
  auVar389 = vmulsd_avx512f(auVar682,auVar486);
  dVar459 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6];
  auVar514._8_8_ = 0;
  auVar514._0_8_ =
       dVar459 + dVar459 +
       auVar392._0_8_ +
       dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8];
  auVar392 = vmulsd_avx512f(auVar704,auVar514);
  dVar421 = dVar421 + auVar387._0_8_ + auVar389._0_8_ + auVar392._0_8_;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar421;
  auVar140._8_8_ = 0;
  auVar140._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar387 = vmulsd_avx512f(auVar690,auVar140);
  auVar141._8_8_ = 0;
  auVar141._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar389 = vmulsd_avx512f(auVar697,auVar141);
  auVar142._8_8_ = 0;
  auVar142._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar392 = vmulsd_avx512f(auVar697,auVar142);
  auVar143._8_8_ = 0;
  auVar143._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar395 = vmulsd_avx512f(auVar697,auVar143);
  auVar144._8_8_ = 0;
  auVar144._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar394 = vmulsd_avx512f(auVar669,auVar144);
  auVar145._8_8_ = 0;
  auVar145._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar396 = vmulsd_avx512f(auVar690,auVar145);
  auVar452._8_8_ = 0;
  auVar452._0_8_ = auVar394._0_8_ + auVar387._0_8_ + auVar389._0_8_;
  auVar387 = vmulsd_avx512f(auVar380,auVar452);
  auVar146._8_8_ = 0;
  auVar146._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar389 = vmulsd_avx512f(auVar669,auVar146);
  auVar147._8_8_ = 0;
  auVar147._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar394 = vmulsd_avx512f(auVar690,auVar147);
  auVar148._8_8_ = 0;
  auVar148._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar397 = vmulsd_avx512f(auVar669,auVar148);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar421 + auVar387._0_8_ +
                 dVar2 * (auVar389._0_8_ + auVar396._0_8_ + auVar392._0_8_) +
                 dVar1 * (auVar397._0_8_ + auVar394._0_8_ + auVar395._0_8_);
  auVar149._8_8_ = 0;
  auVar149._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar387 = vmulsd_avx512f(auVar682,auVar149);
  auVar150._8_8_ = 0;
  auVar150._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar389 = vmulsd_avx512f(auVar704,auVar150);
  auVar151._8_8_ = 0;
  auVar151._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar705._8_8_ = 0;
  auVar705._0_8_ = local_38;
  auVar392 = vmulsd_avx512f(auVar705,auVar151);
  auVar152._8_8_ = 0;
  auVar152._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar395 = vmulsd_avx512f(auVar682,auVar152);
  auVar153._8_8_ = 0;
  auVar153._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar394 = vmulsd_avx512f(auVar697,auVar153);
  auVar154._8_8_ = 0;
  auVar154._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar396 = vmulsd_avx512f(auVar677,auVar154);
  auVar155._8_8_ = 0;
  auVar155._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar397 = vmulsd_avx512f(auVar682,auVar155);
  auVar419._8_8_ = 0;
  auVar419._0_8_ = auVar396._0_8_ + auVar387._0_8_ + auVar389._0_8_;
  auVar387 = vmulsd_avx512f(auVar669,auVar419);
  auVar156._8_8_ = 0;
  auVar156._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar389 = vmulsd_avx512f(auVar677,auVar156);
  auVar157._8_8_ = 0;
  auVar157._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar396 = vmulsd_avx512f(auVar705,auVar157);
  auVar453._8_8_ = 0;
  auVar453._0_8_ = auVar389._0_8_ + auVar397._0_8_ + auVar392._0_8_;
  auVar389 = vmulsd_avx512f(auVar690,auVar453);
  auVar158._8_8_ = 0;
  auVar158._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar392 = vmulsd_avx512f(auVar677,auVar158);
  local_98 = auVar386._0_8_;
  auVar487._8_8_ = 0;
  auVar487._0_8_ = auVar392._0_8_ + auVar395._0_8_ + auVar396._0_8_;
  auVar386 = vmulsd_avx512f(auVar697,auVar487);
  auVar159._8_8_ = 0;
  auVar159._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar392 = vmulsd_avx512f(auVar682,auVar159);
  auVar160._8_8_ = 0;
  auVar160._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar395 = vmulsd_avx512f(auVar677,auVar160);
  auVar161._8_8_ = 0;
  auVar161._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar396 = vmulsd_avx512f(auVar682,auVar161);
  auVar454._8_8_ = 0;
  auVar454._0_8_ =
       (local_98 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [2] - auVar392._0_8_) - auVar395._0_8_;
  auVar392 = vmulsd_avx512f(auVar717,auVar454);
  auVar162._8_8_ = 0;
  auVar162._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar395 = vmulsd_avx512f(auVar677,auVar162);
  auVar163._8_8_ = 0;
  auVar163._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar397 = vmulsd_avx512f(auVar682,auVar163);
  auVar488._8_8_ = 0;
  auVar488._0_8_ =
       (local_98 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [5] - auVar396._0_8_) - auVar395._0_8_;
  auVar395 = vmulsd_avx512f(auVar711,auVar488);
  auVar164._8_8_ = 0;
  auVar164._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar396 = vmulsd_avx512f(auVar677,auVar164);
  auVar165._8_8_ = 0;
  auVar165._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar398 = vmulsd_avx512f(auVar690,auVar165);
  auVar515._8_8_ = 0;
  auVar515._0_8_ =
       (local_98 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [8] - auVar397._0_8_) - auVar396._0_8_;
  auVar396 = vmulsd_avx512f(auVar714,auVar515);
  auVar166._8_8_ = 0;
  auVar166._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar397 = vmulsd_avx512f(auVar690,auVar166);
  auVar167._8_8_ = 0;
  auVar167._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar399 = vmulsd_avx512f(auVar690,auVar167);
  auVar168._8_8_ = 0;
  auVar168._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar400 = vmulsd_avx512f(auVar385,auVar168);
  auVar169._8_8_ = 0;
  auVar169._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar401 = vmulsd_avx512f(auVar669,auVar169);
  auVar170._8_8_ = 0;
  auVar170._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar402 = vmulsd_avx512f(auVar385,auVar170);
  auVar455._8_8_ = 0;
  auVar455._0_8_ = (auVar400._0_8_ - auVar399._0_8_) - auVar401._0_8_;
  auVar399 = vmulsd_avx512f(auVar669,auVar455);
  auVar171._8_8_ = 0;
  auVar171._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar400 = vmulsd_avx512f(auVar669,auVar171);
  auVar172._8_8_ = 0;
  auVar172._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar385 = vmulsd_avx512f(auVar385,auVar172);
  auVar489._8_8_ = 0;
  auVar489._0_8_ = (auVar402._0_8_ - auVar397._0_8_) - auVar400._0_8_;
  auVar397 = vmulsd_avx512f(auVar690,auVar489);
  auVar173._8_8_ = 0;
  auVar173._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar400 = vmulsd_avx512f(auVar669,auVar173);
  auVar174._8_8_ = 0;
  auVar174._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar401 = vmulsd_avx512f(auVar697,auVar174);
  auVar516._8_8_ = 0;
  auVar516._0_8_ = (auVar385._0_8_ - auVar398._0_8_) - auVar400._0_8_;
  auVar385 = vmulsd_avx512f(auVar697,auVar516);
  auVar175._8_8_ = 0;
  auVar175._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar398 = vmulsd_avx512f(auVar697,auVar175);
  auVar176._8_8_ = 0;
  auVar176._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar400 = vmulsd_avx512f(auVar690,auVar176);
  auVar177._8_8_ = 0;
  auVar177._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar402 = vmulsd_avx512f(auVar669,auVar177);
  auVar178._8_8_ = 0;
  auVar178._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar390 = vmulsd_avx512f(auVar690,auVar178);
  auVar179._8_8_ = 0;
  auVar179._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar391 = vmulsd_avx512f(auVar669,auVar179);
  auVar180._8_8_ = 0;
  auVar180._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar393 = vmulsd_avx512f(auVar690,auVar180);
  auVar181._8_8_ = 0;
  auVar181._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar403 = vmulsd_avx512f(auVar669,auVar181);
  auVar404 = vxorpd_avx512vl(auVar379,auVar413);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] =
       auVar387._0_8_ + auVar389._0_8_ + auVar386._0_8_ +
       auVar392._0_8_ + auVar395._0_8_ + auVar396._0_8_ +
       auVar399._0_8_ + auVar397._0_8_ + auVar385._0_8_ +
       (auVar402._0_8_ + auVar400._0_8_ + auVar398._0_8_) * local_78 +
       (auVar391._0_8_ + auVar390._0_8_ + auVar401._0_8_) * local_60 +
       (auVar403._0_8_ + auVar393._0_8_ + auVar394._0_8_) * local_48;
  dVar459 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1];
  dVar421 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4];
  dVar420 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7];
  dVar526 = (dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[0] +
            dVar459 + dVar459 +
            dVar610 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2]) * local_70 +
            (dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[3] +
            dVar421 + dVar421 +
            dVar610 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5]) * local_58 +
            (dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[6] +
            dVar420 + dVar420 +
            dVar610 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]) * local_40;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  auVar555._8_8_ = 0;
  auVar555._0_8_ = local_38;
  auVar536._8_8_ = 0;
  auVar536._0_8_ =
       local_68 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       + local_38 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [5] + local_50 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4];
  auVar385 = vmulsd_avx512f(auVar379,auVar536);
  dVar459 = local_50 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7] +
            local_38 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8] +
            local_68 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6];
  dVar526 = dVar526 + dVar2 * (local_68 *
                               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[0] +
                              local_50 *
                              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[1] +
                              local_38 *
                              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[2]) + (auVar385._0_8_ - (dVar459 + dVar459));
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  dVar459 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1];
  auVar182._8_8_ = 0;
  auVar182._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar385 = vmulsd_avx512f(auVar404,auVar182);
  dVar421 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4];
  auVar183._8_8_ = 0;
  auVar183._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar386 = vmulsd_avx512f(auVar404,auVar183);
  auVar184._8_8_ = 0;
  auVar184._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar387 = vmulsd_avx512f(auVar404,auVar184);
  dVar420 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7];
  dVar526 = dVar526 + ((auVar385._0_8_ - (dVar459 + dVar459)) -
                      dVar1 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[0]) * local_78 +
                      ((auVar387._0_8_ - (dVar421 + dVar421)) -
                      dVar1 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[3]) * local_60 +
                      ((auVar386._0_8_ - (dVar420 + dVar420)) -
                      dVar1 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[6]) * local_48;
  auVar385 = vxorpd_avx512vl(auVar555,auVar413);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  dVar459 = auVar385._0_8_;
  auVar537._8_8_ = 0;
  auVar537._0_8_ =
       (dVar459 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2] -
       local_50 *
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
       ) - local_68 *
           (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
  auVar385 = vmulsd_avx512f(auVar380,auVar537);
  dVar526 = dVar526 + auVar385._0_8_ +
                      dVar2 * ((dVar459 * (yyF->
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          ).m_storage.m_data.array[5] -
                               local_50 *
                               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[4]) -
                              local_68 *
                              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[3]) +
                      dVar1 * ((dVar459 * (yyF->
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          ).m_storage.m_data.array[8] -
                               local_50 *
                               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[7]) -
                              local_68 *
                              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[6]);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  auVar185._8_8_ = 0;
  auVar185._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar385 = vmulsd_avx512f(auVar655,auVar185);
  auVar186._8_8_ = 0;
  auVar186._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar386 = vmulsd_avx512f(auVar655,auVar186);
  auVar187._8_8_ = 0;
  auVar187._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar656._8_8_ = 0;
  auVar656._0_8_ = dVar500;
  auVar387 = vmulsd_avx512f(auVar656,auVar187);
  dVar526 = dVar526 + (auVar385._0_8_ +
                      dVar576 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[1] +
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] * 4.0) * local_70 +
                      (auVar386._0_8_ +
                      dVar576 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[4] +
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5] * 4.0) * local_58 +
                      (auVar387._0_8_ +
                      dVar576 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7] +
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8] * 4.0) * local_40;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  dVar459 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2];
  auVar188._8_8_ = 0;
  auVar188._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar385 = vmulsd_avx512f(auVar379,auVar188);
  dVar421 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5];
  dVar420 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8];
  auVar189._8_8_ = 0;
  auVar189._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar386 = vmulsd_avx512f(auVar379,auVar189);
  auVar190._8_8_ = 0;
  auVar190._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar387 = vmulsd_avx512f(auVar379,auVar190);
  dVar526 = dVar526 + (dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[0] + (auVar385._0_8_ - (dVar459 + dVar459))) *
                      local_78 +
                      (dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[3] + (auVar386._0_8_ - (dVar421 + dVar421))) *
                      local_60 +
                      ((auVar387._0_8_ - (dVar420 + dVar420)) +
                      dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[6]) * local_48;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  auVar538._8_8_ = 0;
  auVar538._0_8_ =
       local_70 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       + local_58 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1] + local_40 *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2];
  auVar385 = vmulsd_avx512f(auVar380,auVar538);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526 + auVar385._0_8_ +
                 dVar2 * (local_70 *
                          (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[3] +
                         local_40 *
                         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5] +
                         local_58 *
                         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4]) +
                 dVar1 * (local_58 *
                          (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[7] +
                          local_40 *
                          (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[8] +
                         local_70 *
                         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[6]);
  dVar459 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  dVar421 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  dVar420 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6];
  dVar526 = ((dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] +
             dVar405 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[2]) - (dVar459 + dVar459)) * local_70 +
            ((dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4] +
             dVar405 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5]) - (dVar421 + dVar421)) * local_58 +
            ((dVar405 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[8] +
             dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[7]) - (dVar420 + dVar420)) * local_40;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  auVar556._8_8_ = 0;
  auVar556._0_8_ = local_38;
  auVar517._8_8_ = 0;
  auVar517._0_8_ =
       local_68 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       + local_50 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1] + local_38 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2];
  auVar385 = vmulsd_avx512f(auVar380,auVar517);
  auVar386 = vxorpd_avx512vl(auVar382,auVar413);
  dVar526 = dVar526 + auVar385._0_8_ +
                      dVar2 * (local_68 *
                               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[3] +
                              local_38 *
                              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[5] +
                              local_50 *
                              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[4]) +
                      dVar1 * (local_50 *
                               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[7] +
                               local_38 *
                               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[8] +
                              local_68 *
                              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[6]);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  dVar611 = auVar386._0_8_;
  dVar459 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  dVar421 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  dVar420 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6];
  dVar526 = dVar526 + ((dVar611 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[2] -
                       dVar1 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[1]) + dVar421 + dVar421) * local_78 +
                      ((dVar611 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[5] -
                       dVar1 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[4]) + dVar459 + dVar459) * local_60 +
                      ((dVar611 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[8] -
                       dVar1 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[7]) + dVar420 + dVar420) * local_48;
  auVar385 = vxorpd_avx512vl(auVar556,auVar413);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  dVar421 = auVar385._0_8_;
  dVar459 = (dVar421 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[8] -
            local_50 *
            (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7]) -
            local_68 *
            (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6];
  auVar557._8_8_ = 0;
  auVar557._0_8_ =
       (dVar421 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] -
       local_50 *
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
       ) - local_68 *
           (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[3];
  auVar385 = vmulsd_avx512f(auVar380,auVar557);
  dVar526 = dVar526 + dVar405 * ((dVar421 * (yyF->
                                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                            ).m_storage.m_data.array[2] -
                                 local_50 *
                                 (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[1]) -
                                local_68 *
                                (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[0]) + auVar385._0_8_ + dVar459 + dVar459;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  auVar191._8_8_ = 0;
  auVar191._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar385 = vmulsd_avx512f(auVar656,auVar191);
  auVar192._8_8_ = 0;
  auVar192._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar386 = vmulsd_avx512f(auVar656,auVar192);
  auVar193._8_8_ = 0;
  auVar193._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar387 = vmulsd_avx512f(auVar656,auVar193);
  dVar526 = dVar526 + (dVar641 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      auVar385._0_8_ +
                      dVar644 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2]) * local_70 +
                      (dVar641 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[3] +
                      auVar386._0_8_ +
                      dVar644 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5]) * local_58 +
                      (dVar641 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      auVar387._0_8_ +
                      dVar644 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8]) * local_40;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  auVar194._8_8_ = 0;
  auVar194._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar385 = vmulsd_avx512f(auVar380,auVar194);
  auVar195._8_8_ = 0;
  auVar195._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar386 = vmulsd_avx512f(auVar380,auVar195);
  auVar196._8_8_ = 0;
  auVar196._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar387 = vmulsd_avx512f(auVar380,auVar196);
  dVar526 = dVar526 + (auVar385._0_8_ +
                      dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[1] +
                      dVar1 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[2]) * local_78 +
                      (auVar386._0_8_ +
                      dVar1 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[5] +
                      dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[4]) * local_60 +
                      (dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[7] +
                       dVar1 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[8] + auVar387._0_8_) * local_48;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  auVar558._8_8_ = 0;
  auVar558._0_8_ =
       local_70 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       + local_40 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [5] + local_58 *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4];
  auVar385 = vmulsd_avx512f(auVar380,auVar558);
  dVar459 = local_58 *
            (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7] +
            local_40 *
            (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8] +
            local_70 *
            (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526 + dVar405 * (local_70 *
                            (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[0] +
                           local_58 *
                           (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[1] +
                           local_40 *
                           (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[2]) + auVar385._0_8_ + dVar459 + dVar459;
  auVar197._8_8_ = 0;
  auVar197._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar385 = vmulsd_avx512f(auVar380,auVar197);
  auVar198._8_8_ = 0;
  auVar198._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar386 = vmulsd_avx512f(auVar380,auVar198);
  auVar199._8_8_ = 0;
  auVar199._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar387 = vmulsd_avx512f(auVar380,auVar199);
  dVar526 = (auVar385._0_8_ +
            dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[1] +
            dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2]) * local_70 +
            (auVar386._0_8_ +
            dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[4] +
            dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[5]) * local_58 +
            (auVar387._0_8_ +
            dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8] +
            dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[7]) * local_40;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  auVar559._8_8_ = 0;
  auVar559._0_8_ = local_38;
  dVar459 = local_68 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0] +
            local_50 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1] +
            local_38 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2];
  auVar614._8_8_ = 0;
  auVar614._0_8_ = local_128;
  dVar526 = dVar526 + dVar459 + dVar459 +
                      local_128 *
                      (local_68 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3] +
                      local_38 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5] +
                      local_50 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4]) +
                      dVar2 * (local_50 *
                               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[7] +
                               local_38 *
                               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[8] +
                              local_68 *
                              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[6]);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  auVar200._8_8_ = 0;
  auVar200._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar385 = vmulsd_avx512f(auVar378,auVar200);
  auVar201._8_8_ = 0;
  auVar201._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar386 = vmulsd_avx512f(auVar380,auVar201);
  auVar202._8_8_ = 0;
  auVar202._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar387 = vmulsd_avx512f(auVar378,auVar202);
  auVar203._8_8_ = 0;
  auVar203._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar389 = vmulsd_avx512f(auVar380,auVar203);
  auVar204._8_8_ = 0;
  auVar204._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar392 = vmulsd_avx512f(auVar378,auVar204);
  dVar405 = auVar378._0_8_;
  auVar205._8_8_ = 0;
  auVar205._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar378 = vmulsd_avx512f(auVar380,auVar205);
  dVar526 = dVar526 + ((auVar385._0_8_ -
                       dVar2 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[1]) - auVar386._0_8_) * local_78 +
                      ((auVar387._0_8_ -
                       dVar2 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[4]) - auVar389._0_8_) * local_60 +
                      ((auVar392._0_8_ -
                       dVar2 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[7]) - auVar378._0_8_) * local_48;
  auVar378 = vxorpd_avx512vl(auVar559,auVar413);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  dVar421 = auVar378._0_8_;
  dVar459 = (dVar421 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] -
            local_50 *
            (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4]) -
            local_68 *
            (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  auVar456._8_8_ = 0;
  auVar456._0_8_ =
       (dVar421 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[8] -
       local_50 *
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
       ) - local_68 *
           (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[6];
  auVar378 = vmulsd_avx512f(auVar380,auVar456);
  dVar526 = dVar526 + local_128 *
                      ((dVar421 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[2] -
                       local_50 *
                       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1]) -
                      local_68 *
                      (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0]) + (auVar378._0_8_ - (dVar459 + dVar459));
  auVar378 = vmulsd_avx512f(auVar614,ZEXT816(0xc000000000000000));
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  dVar406 = auVar378._0_8_;
  auVar206._8_8_ = 0;
  auVar206._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar378 = vmulsd_avx512f(auVar656,auVar206);
  auVar207._8_8_ = 0;
  auVar207._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar385 = vmulsd_avx512f(auVar656,auVar207);
  auVar208._8_8_ = 0;
  auVar208._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar386 = vmulsd_avx512f(auVar656,auVar208);
  auVar597._8_8_ = 0;
  auVar597._0_8_ = local_40;
  auVar560._8_8_ = 0;
  auVar560._0_8_ = local_70;
  dVar526 = dVar526 + ((dVar406 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[1] + auVar378._0_8_) -
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0] * 4.0) * local_70 +
                      ((dVar406 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[4] + auVar385._0_8_) -
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3] * 4.0) * local_58 +
                      local_40 *
                      ((dVar406 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[7] + auVar386._0_8_) -
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[6] * 4.0);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  dVar459 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  dVar421 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  auVar209._8_8_ = 0;
  auVar209._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar378 = vmulsd_avx512f(auVar614,auVar209);
  auVar210._8_8_ = 0;
  auVar210._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar385 = vmulsd_avx512f(auVar614,auVar210);
  dVar420 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6];
  auVar626._8_8_ = 0;
  auVar626._0_8_ = local_48;
  auVar615._8_8_ = 0;
  auVar615._0_8_ = local_60;
  auVar539._8_8_ = 0;
  auVar539._0_8_ = local_78;
  dVar526 = dVar526 + (dVar459 + dVar459 +
                      dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[2] +
                      local_128 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1]) * local_78 +
                      local_60 *
                      (dVar421 + dVar421 +
                      dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[5] + auVar378._0_8_) +
                      local_48 *
                      (auVar385._0_8_ +
                       dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[8] + dVar420 + dVar420);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526;
  auVar211._8_8_ = 0;
  auVar211._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar378 = vmulsd_avx512f(auVar597,auVar211);
  auVar490._8_8_ = 0;
  auVar490._0_8_ =
       local_70 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       + local_58 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1] + local_40 *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2];
  auVar385 = vmulsd_avx512f(auVar614,auVar490);
  auVar518._8_8_ = 0;
  auVar518._0_8_ =
       local_58 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar378 = vaddsd_avx512f(auVar518,auVar378);
  auVar212._8_8_ = 0;
  auVar212._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar386 = vmulsd_avx512f(auVar560,auVar212);
  auVar378 = vaddsd_avx512f(auVar386,auVar378);
  auVar561._8_8_ = 0;
  auVar561._0_8_ =
       local_70 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       + local_40 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [8] + local_58 *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7];
  auVar386 = vmulsd_avx512f(auVar380,auVar561);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar526 + auVar385._0_8_ + (auVar386._0_8_ - (auVar378._0_8_ + auVar378._0_8_));
  auVar378 = vmulsd_avx512f(auVar626,ZEXT816(0xc000000000000000));
  dVar420 = auVar378._0_8_;
  auVar389 = ZEXT816(0xc000000000000000);
  auVar378 = vmulsd_avx512f(auVar539,auVar389);
  auVar385 = vmulsd_avx512f(auVar615,auVar389);
  dVar421 = auVar385._0_8_;
  dVar459 = auVar378._0_8_;
  auVar579._8_8_ = 0;
  auVar579._0_8_ = local_48;
  auVar562._8_8_ = 0;
  auVar562._0_8_ = dVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] =
       local_78 *
       (local_78 *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_60 *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_48 *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) +
       local_60 *
       (local_78 *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] + local_60 *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4] +
              local_48 *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5]) +
       local_48 *
       (local_78 *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_60 *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_48 *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) +
       (dVar459 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] +
       dVar420 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2] +
       dVar421 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1]) * local_68 +
       (dVar421 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[4] +
        dVar420 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] +
       dVar459 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3]) * local_50 +
       local_38 *
       (dVar459 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[6] +
       dVar421 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] +
       dVar420 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8]) +
       local_68 *
       (local_68 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_50 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_38 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) +
       local_50 *
       (local_68 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] + local_38 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] +
              local_50 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) +
       local_38 *
       (local_50 *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7] + local_38 *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8] +
       local_68 *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       );
  auVar213._8_8_ = 0;
  auVar213._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar378 = vmulsd_avx512f(auVar388,auVar213);
  auVar214._8_8_ = 0;
  auVar214._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar385 = vmulsd_avx512f(auVar388,auVar214);
  auVar215._8_8_ = 0;
  auVar215._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar386 = vmulsd_avx512f(auVar388,auVar215);
  auVar563._8_8_ = 0;
  auVar563._0_8_ = local_60;
  auVar540._8_8_ = 0;
  auVar540._0_8_ = local_78;
  dVar459 = (auVar378._0_8_ +
            dVar4 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[1] +
            dVar377 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2]) * local_78 +
            (auVar385._0_8_ +
            dVar4 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[4] +
            dVar377 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5]) * local_60 +
            (auVar386._0_8_ +
            dVar4 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[7] +
            dVar377 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]) * local_48;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       dVar459;
  auVar216._8_8_ = 0;
  auVar216._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vmulsd_avx512f(auVar655,auVar216);
  auVar217._8_8_ = 0;
  auVar217._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar385 = vmulsd_avx512f(auVar655,auVar217);
  auVar218._8_8_ = 0;
  auVar218._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar386 = vmulsd_avx512f(auVar655,auVar218);
  auVar387 = vmulsd_avx512f(auVar563,auVar389);
  auVar389 = vmulsd_avx512f(auVar579,auVar389);
  dVar459 = dVar459 + local_68 *
                      (dVar641 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      dVar644 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2] + auVar378._0_8_) +
                      (dVar641 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      auVar386._0_8_ +
                      dVar644 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8]) * local_38 +
                      local_50 *
                      (auVar385._0_8_ +
                       dVar644 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[5] +
                      dVar641 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[3]);
  auVar403 = ZEXT816(0xc000000000000000);
  auVar378 = vmulsd_avx512f(auVar540,auVar403);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       dVar459;
  dVar421 = auVar387._0_8_;
  auVar219._8_8_ = 0;
  auVar219._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar385 = vmulsd_avx512f(auVar389,auVar219);
  auVar580._8_8_ = 0;
  auVar580._0_8_ =
       dVar421 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4];
  auVar385 = vaddsd_avx512f(auVar580,auVar385);
  auVar220._8_8_ = 0;
  auVar220._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar386 = vmulsd_avx512f(auVar378,auVar220);
  auVar385 = vaddsd_avx512f(auVar386,auVar385);
  auVar491._8_8_ = 0;
  auVar491._0_8_ =
       auVar378._0_8_ *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       + dVar421 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[7] +
         auVar389._0_8_ *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [8];
  auVar386 = vmulsd_avx512f(auVar379,auVar491);
  dVar459 = dVar459 + dVar1 * (auVar378._0_8_ *
                               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[0] +
                              dVar421 * (zxF->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        ).m_storage.m_data.array[1] +
                              auVar389._0_8_ *
                              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[2]) +
                      auVar385._0_8_ + auVar385._0_8_ + auVar386._0_8_;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       dVar459;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       dVar459 + local_68 *
                 (dVar377 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[0] +
                 (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] * 4.0 +
                 dVar497 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[2]) +
                 local_50 *
                 (dVar377 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[3] +
                 (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4] * 4.0 +
                 dVar497 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[5]) +
                 local_38 *
                 (dVar377 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[6] +
                 (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] * 4.0 +
                 dVar497 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[8]);
  auVar221._8_8_ = 0;
  auVar221._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vmulsd_avx512f(auVar388,auVar221);
  auVar222._8_8_ = 0;
  auVar222._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar718._8_8_ = 0;
  auVar718._0_8_ = dVar498;
  auVar385 = vmulsd_avx512f(auVar718,auVar222);
  auVar581._8_8_ = 0;
  auVar581._0_8_ = local_48;
  auVar223._8_8_ = 0;
  auVar223._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar386 = vmulsd_avx512f(auVar388,auVar223);
  auVar224._8_8_ = 0;
  auVar224._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar387 = vmulsd_avx512f(auVar718,auVar224);
  auVar225._8_8_ = 0;
  auVar225._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar389 = vmulsd_avx512f(auVar388,auVar225);
  auVar226._8_8_ = 0;
  auVar226._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar719._8_8_ = 0;
  auVar719._0_8_ = dVar498;
  auVar392 = vmulsd_avx512f(auVar719,auVar226);
  auVar564._8_8_ = 0;
  auVar564._0_8_ = local_60;
  auVar541._8_8_ = 0;
  auVar541._0_8_ = local_78;
  dVar421 = (auVar385._0_8_ +
            auVar378._0_8_ +
            (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2] * 4.0) * local_78 +
            (auVar387._0_8_ +
            auVar386._0_8_ +
            (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5] * 4.0) * local_60 +
            (auVar392._0_8_ +
            auVar389._0_8_ +
            (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8] * 4.0) * local_48;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       dVar421;
  auVar227._8_8_ = 0;
  auVar227._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar724._8_8_ = 0;
  auVar724._0_8_ = dVar499;
  auVar378 = vmulsd_avx512f(auVar724,auVar227);
  auVar228._8_8_ = 0;
  auVar228._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar385 = vmulsd_avx512f(auVar724,auVar228);
  auVar229._8_8_ = 0;
  auVar229._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar725._8_8_ = 0;
  auVar725._0_8_ = dVar499;
  auVar386 = vmulsd_avx512f(auVar725,auVar229);
  auVar387 = vmulsd_avx512f(auVar564,auVar403);
  auVar389 = vmulsd_avx512f(auVar581,auVar403);
  dVar421 = dVar421 + local_68 *
                      (auVar378._0_8_ +
                      (dVar641 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[1] -
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] * 4.0)) +
                      (auVar386._0_8_ +
                      (dVar641 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[7] -
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8] * 4.0)) * local_38 +
                      local_50 *
                      ((dVar641 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[4] -
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] * 4.0) + auVar385._0_8_);
  auVar378 = vmulsd_avx512f(auVar541,auVar403);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       dVar421;
  dVar420 = auVar387._0_8_;
  auVar230._8_8_ = 0;
  auVar230._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar385 = vmulsd_avx512f(auVar389,auVar230);
  dVar459 = auVar378._0_8_ *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0] +
            dVar420 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] +
            auVar389._0_8_ *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2];
  auVar582._8_8_ = 0;
  auVar582._0_8_ =
       dVar420 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4];
  auVar385 = vaddsd_avx512f(auVar582,auVar385);
  auVar231._8_8_ = 0;
  auVar231._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar386 = vmulsd_avx512f(auVar378,auVar231);
  auVar385 = vaddsd_avx512f(auVar386,auVar385);
  auVar492._8_8_ = 0;
  auVar492._0_8_ =
       auVar378._0_8_ *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       + dVar420 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[7] +
         auVar389._0_8_ *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [8];
  auVar378 = vmulsd_avx512f(auVar382,auVar492);
  dVar421 = dVar421 + ((dVar1 * auVar385._0_8_ + auVar378._0_8_) - (dVar459 + dVar459));
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       dVar421;
  auVar232._8_8_ = 0;
  auVar232._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar378 = vmulsd_avx512f(auVar719,auVar232);
  auVar233._8_8_ = 0;
  auVar233._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar385 = vmulsd_avx512f(auVar719,auVar233);
  auVar234._8_8_ = 0;
  auVar234._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar386 = vmulsd_avx512f(auVar719,auVar234);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       dVar421 + local_68 *
                 ((dVar377 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                             m_storage.m_data.array[1] + auVar378._0_8_) -
                 (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0] * 4.0) +
                 local_50 *
                 ((dVar377 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                             m_storage.m_data.array[4] + auVar385._0_8_) -
                 (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3] * 4.0) +
                 local_38 *
                 ((dVar377 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                             m_storage.m_data.array[7] + auVar386._0_8_) -
                 (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[6] * 4.0);
  auVar235._8_8_ = 0;
  auVar235._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar378 = vmulsd_avx512f(auVar388,auVar235);
  auVar236._8_8_ = 0;
  auVar236._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar721._8_8_ = 0;
  auVar721._0_8_ = dVar501;
  auVar385 = vmulsd_avx512f(auVar721,auVar236);
  auVar237._8_8_ = 0;
  auVar237._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar386 = vmulsd_avx512f(auVar388,auVar237);
  auVar238._8_8_ = 0;
  auVar238._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar387 = vmulsd_avx512f(auVar388,auVar238);
  auVar583._8_8_ = 0;
  auVar583._0_8_ = local_48;
  auVar239._8_8_ = 0;
  auVar239._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar389 = vmulsd_avx512f(auVar721,auVar239);
  auVar240._8_8_ = 0;
  auVar240._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar722._8_8_ = 0;
  auVar722._0_8_ = dVar501;
  auVar392 = vmulsd_avx512f(auVar722,auVar240);
  auVar565._8_8_ = 0;
  auVar565._0_8_ = local_60;
  auVar542._8_8_ = 0;
  auVar542._0_8_ = local_78;
  dVar459 = (auVar385._0_8_ +
            (auVar378._0_8_ -
            (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1] * 4.0)) * local_78 +
            (auVar389._0_8_ +
            (auVar386._0_8_ -
            (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4] * 4.0)) * local_60 +
            (auVar392._0_8_ +
            (auVar387._0_8_ -
            (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7] * 4.0)) * local_48;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       dVar459;
  auVar378 = vmulsd_avx512f(auVar565,auVar403);
  auVar385 = vmulsd_avx512f(auVar583,auVar403);
  dVar459 = dVar459 + local_68 *
                      (dVar406 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      dVar641 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2] +
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] * 4.0) +
                      (dVar406 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] * 4.0 +
                      dVar641 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8]) * local_38 +
                      local_50 *
                      ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] * 4.0 +
                       dVar641 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[5] +
                      dVar406 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[3]);
  auVar386 = vmulsd_avx512f(auVar542,auVar403);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       dVar459;
  dVar421 = auVar378._0_8_;
  auVar241._8_8_ = 0;
  auVar241._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar378 = vmulsd_avx512f(auVar385,auVar241);
  auVar584._8_8_ = 0;
  auVar584._0_8_ =
       dVar421 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4];
  auVar378 = vaddsd_avx512f(auVar584,auVar378);
  auVar242._8_8_ = 0;
  auVar242._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar387 = vmulsd_avx512f(auVar386,auVar242);
  auVar378 = vaddsd_avx512f(auVar387,auVar378);
  auVar543._8_8_ = 0;
  auVar543._0_8_ =
       auVar386._0_8_ *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       + dVar421 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] +
         auVar385._0_8_ *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [2];
  auVar387 = vmulsd_avx512f(auVar380,auVar543);
  dVar459 = dVar459 + auVar387._0_8_ +
                      dVar2 * auVar378._0_8_ +
                      dVar1 * (auVar386._0_8_ *
                               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[6] +
                              dVar421 * (zxF->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        ).m_storage.m_data.array[7] +
                              auVar385._0_8_ *
                              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[8]);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       dVar459;
  auVar243._8_8_ = 0;
  auVar243._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vmulsd_avx512f(auVar562,auVar243);
  auVar244._8_8_ = 0;
  auVar244._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar385 = vmulsd_avx512f(auVar388,auVar244);
  auVar245._8_8_ = 0;
  auVar245._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar386 = vmulsd_avx512f(auVar562,auVar245);
  auVar246._8_8_ = 0;
  auVar246._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar387 = vmulsd_avx512f(auVar388,auVar246);
  auVar247._8_8_ = 0;
  auVar247._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar389 = vmulsd_avx512f(auVar562,auVar247);
  auVar248._8_8_ = 0;
  auVar248._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar392 = vmulsd_avx512f(auVar388,auVar248);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       dVar459 + local_68 *
                 (auVar385._0_8_ +
                 auVar378._0_8_ +
                 dVar377 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[2]) +
                 local_50 *
                 (auVar387._0_8_ +
                 auVar386._0_8_ +
                 dVar377 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[5]) +
                 local_38 *
                 (auVar392._0_8_ +
                 auVar389._0_8_ +
                 dVar377 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[8]);
  auVar249._8_8_ = 0;
  auVar249._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar691._8_8_ = 0;
  auVar691._0_8_ = local_60;
  auVar378 = vmulsd_avx512f(auVar691,auVar249);
  auVar250._8_8_ = 0;
  auVar250._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar698._8_8_ = 0;
  auVar698._0_8_ = local_48;
  auVar385 = vmulsd_avx512f(auVar698,auVar250);
  auVar251._8_8_ = 0;
  auVar251._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar683._8_8_ = 0;
  auVar683._0_8_ = local_78;
  auVar386 = vmulsd_avx512f(auVar683,auVar251);
  auVar252._8_8_ = 0;
  auVar252._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar387 = vmulsd_avx512f(auVar698,auVar252);
  auVar253._8_8_ = 0;
  auVar253._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar699._8_8_ = 0;
  auVar699._0_8_ = local_48;
  auVar389 = vmulsd_avx512f(auVar699,auVar253);
  auVar254._8_8_ = 0;
  auVar254._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar392 = vmulsd_avx512f(auVar691,auVar254);
  auVar255._8_8_ = 0;
  auVar255._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar692._8_8_ = 0;
  auVar692._0_8_ = local_60;
  auVar395 = vmulsd_avx512f(auVar692,auVar255);
  auVar256._8_8_ = 0;
  auVar256._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar394 = vmulsd_avx512f(auVar692,auVar256);
  auVar257._8_8_ = 0;
  auVar257._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar396 = vmulsd_avx512f(auVar683,auVar257);
  auVar258._8_8_ = 0;
  auVar258._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar397 = vmulsd_avx512f(auVar692,auVar258);
  auVar259._8_8_ = 0;
  auVar259._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar684._8_8_ = 0;
  auVar684._0_8_ = local_78;
  auVar398 = vmulsd_avx512f(auVar684,auVar259);
  auVar566._8_8_ = 0;
  auVar566._0_8_ = local_58;
  auVar399 = vxorpd_avx512vl(auVar699,auVar413);
  dVar459 = auVar399._0_8_;
  auVar260._8_8_ = 0;
  auVar260._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar399 = vmulsd_avx512f(auVar684,auVar260);
  auVar544._8_8_ = 0;
  auVar544._0_8_ =
       (dVar459 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2] - auVar392._0_8_) - auVar399._0_8_;
  auVar392 = vmulsd_avx512f(auVar684,auVar544);
  auVar261._8_8_ = 0;
  auVar261._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar399 = vmulsd_avx512f(auVar684,auVar261);
  auVar262._8_8_ = 0;
  auVar262._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar400 = vmulsd_avx512f(auVar692,auVar262);
  auVar598._8_8_ = 0;
  auVar598._0_8_ =
       (dVar459 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] - auVar395._0_8_) - auVar399._0_8_;
  auVar693._8_8_ = 0;
  auVar693._0_8_ = local_60;
  auVar395 = vmulsd_avx512f(auVar693,auVar598);
  auVar263._8_8_ = 0;
  auVar263._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar685._8_8_ = 0;
  auVar685._0_8_ = local_78;
  auVar399 = vmulsd_avx512f(auVar685,auVar263);
  auVar519._8_8_ = 0;
  auVar519._0_8_ =
       (dVar459 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[8] - auVar400._0_8_) - auVar399._0_8_;
  auVar399 = vmulsd_avx512f(auVar699,auVar519);
  auVar545._8_8_ = 0;
  auVar545._0_8_ = local_38;
  auVar520._8_8_ = 0;
  auVar520._0_8_ = local_50;
  auVar264._8_8_ = 0;
  auVar264._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar400 = vmulsd_avx512f(auVar520,auVar264);
  auVar401 = vxorpd_avx512vl(auVar545,auVar413);
  auVar627._8_8_ = 0;
  auVar627._0_8_ = local_68;
  auVar265._8_8_ = 0;
  auVar265._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar402 = vmulsd_avx512f(auVar627,auVar265);
  auVar616._8_8_ = 0;
  auVar616._0_8_ =
       auVar401._0_8_ *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
       - local_50 *
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1];
  auVar402 = vsubsd_avx512f(auVar616,auVar402);
  auVar266._8_8_ = 0;
  auVar266._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar390 = vmulsd_avx512f(auVar401,auVar266);
  auVar400 = vsubsd_avx512f(auVar390,auVar400);
  auVar267._8_8_ = 0;
  auVar267._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar390 = vmulsd_avx512f(auVar627,auVar267);
  auVar400 = vsubsd_avx512f(auVar400,auVar390);
  auVar268._8_8_ = 0;
  auVar268._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar390 = vmulsd_avx512f(auVar520,auVar268);
  auVar400 = vmulsd_avx512f(auVar400,auVar566);
  auVar599._8_8_ = 0;
  auVar599._0_8_ =
       auVar401._0_8_ *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar401 = vsubsd_avx512f(auVar599,auVar390);
  auVar269._8_8_ = 0;
  auVar269._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar390 = vmulsd_avx512f(auVar627,auVar269);
  auVar401 = vsubsd_avx512f(auVar401,auVar390);
  auVar493._8_8_ = 0;
  auVar493._0_8_ =
       local_68 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       + local_50 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1] + local_38 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2];
  auVar390 = vmulsd_avx512f(auVar493,auVar685);
  auVar567._8_8_ = 0;
  auVar567._0_8_ =
       local_68 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       + local_50 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [4] + local_38 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5];
  auVar391 = vmulsd_avx512f(auVar567,auVar693);
  auVar521._8_8_ = 0;
  auVar521._0_8_ =
       local_68 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       + local_50 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] + local_38 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8];
  auVar393 = vmulsd_avx512f(auVar521,auVar699);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] =
       (auVar386._0_8_ + auVar378._0_8_ + auVar385._0_8_) * local_70 +
       (auVar396._0_8_ + auVar394._0_8_ + auVar387._0_8_) * local_58 +
       (auVar398._0_8_ + auVar397._0_8_ + auVar389._0_8_) * local_40 +
       auVar392._0_8_ + auVar395._0_8_ + auVar399._0_8_ +
       auVar402._0_8_ * local_70 + auVar400._0_8_ + auVar401._0_8_ * local_40 +
       auVar390._0_8_ + auVar391._0_8_ + auVar393._0_8_;
  auVar270._8_8_ = 0;
  auVar270._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar378 = vmulsd_avx512f(auVar380,auVar270);
  auVar271._8_8_ = 0;
  auVar271._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar385 = vmulsd_avx512f(auVar380,auVar271);
  auVar272._8_8_ = 0;
  auVar272._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar386 = vmulsd_avx512f(auVar380,auVar272);
  dVar526 = (auVar378._0_8_ +
            dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[1] +
            dVar1 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2]) * local_70 +
            (auVar385._0_8_ +
            dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[4] +
            dVar1 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[5]) * local_58 +
            (auVar386._0_8_ +
            dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[7] +
            dVar1 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8]) * local_40;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar526;
  auVar273._8_8_ = 0;
  auVar273._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vmulsd_avx512f(auVar693,auVar273);
  auVar274._8_8_ = 0;
  auVar274._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar700._8_8_ = 0;
  auVar700._0_8_ = local_48;
  auVar385 = vmulsd_avx512f(auVar700,auVar274);
  auVar275._8_8_ = 0;
  auVar275._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar386 = vmulsd_avx512f(auVar700,auVar275);
  auVar276._8_8_ = 0;
  auVar276._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar387 = vmulsd_avx512f(auVar700,auVar276);
  auVar277._8_8_ = 0;
  auVar277._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar389 = vmulsd_avx512f(auVar685,auVar277);
  auVar278._8_8_ = 0;
  auVar278._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar392 = vmulsd_avx512f(auVar693,auVar278);
  auVar279._8_8_ = 0;
  auVar279._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar395 = vmulsd_avx512f(auVar685,auVar279);
  auVar280._8_8_ = 0;
  auVar280._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar394 = vmulsd_avx512f(auVar693,auVar280);
  auVar585._8_8_ = 0;
  auVar585._0_8_ = auVar395._0_8_ + auVar386._0_8_ + auVar392._0_8_;
  auVar386 = vmulsd_avx512f(auVar379,auVar585);
  auVar281._8_8_ = 0;
  auVar281._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar392 = vmulsd_avx512f(auVar685,auVar281);
  dVar459 = auVar392._0_8_ + auVar394._0_8_ + auVar387._0_8_;
  dVar526 = dVar526 + dVar2 * (auVar389._0_8_ + auVar378._0_8_ + auVar385._0_8_) +
                      (auVar386._0_8_ - (dVar459 + dVar459));
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar526;
  auVar282._8_8_ = 0;
  auVar282._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vmulsd_avx512f(auVar655,auVar282);
  auVar283._8_8_ = 0;
  auVar283._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar385 = vmulsd_avx512f(auVar655,auVar283);
  auVar568._8_8_ = 0;
  auVar568._0_8_ =
       dVar641 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0] +
       auVar378._0_8_ +
       dVar644 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2];
  auVar378 = vmulsd_avx512f(auVar568,auVar685);
  auVar284._8_8_ = 0;
  auVar284._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar386 = vmulsd_avx512f(auVar655,auVar284);
  auVar586._8_8_ = 0;
  auVar586._0_8_ =
       dVar641 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3] +
       dVar644 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5] + auVar385._0_8_;
  auVar385 = vmulsd_avx512f(auVar586,auVar693);
  auVar600._8_8_ = 0;
  auVar600._0_8_ =
       dVar641 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[6] +
       auVar386._0_8_ +
       dVar644 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8];
  auVar386 = vmulsd_avx512f(auVar600,auVar700);
  dVar526 = dVar526 + auVar378._0_8_ + auVar386._0_8_ + auVar385._0_8_;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar526;
  dVar459 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1];
  auVar285._8_8_ = 0;
  auVar285._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar378 = vmulsd_avx512f(auVar404,auVar285);
  dVar421 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4];
  auVar286._8_8_ = 0;
  auVar286._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar385 = vmulsd_avx512f(auVar404,auVar286);
  auVar287._8_8_ = 0;
  auVar287._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar386 = vmulsd_avx512f(auVar404,auVar287);
  dVar420 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7];
  dVar526 = dVar526 + ((auVar378._0_8_ - (dVar459 + dVar459)) -
                      dVar1 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[0]) * local_70 +
                      ((auVar386._0_8_ - (dVar421 + dVar421)) -
                      dVar1 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[3]) * local_58 +
                      ((auVar385._0_8_ - (dVar420 + dVar420)) -
                      dVar1 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[6]) * local_40;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar526;
  auVar587._8_8_ = 0;
  auVar587._0_8_ = local_38;
  auVar457._8_8_ = 0;
  auVar457._0_8_ = local_68;
  auVar378 = vxorpd_avx512vl(auVar587,auVar413);
  dVar421 = auVar378._0_8_;
  auVar601._8_8_ = 0;
  auVar601._0_8_ =
       (dVar421 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] -
       local_50 *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
       ) - local_68 *
           (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[3];
  auVar378 = vmulsd_avx512f(auVar379,auVar601);
  dVar459 = (dVar421 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[8] -
            local_50 *
            (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7]) -
            local_68 *
            (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6];
  dVar526 = dVar526 + dVar2 * ((dVar421 * (xxF->
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          ).m_storage.m_data.array[2] -
                               local_50 *
                               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[1]) -
                              local_68 *
                              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[0]) + (auVar378._0_8_ - (dVar459 + dVar459));
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar526;
  dVar459 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1];
  auVar288._8_8_ = 0;
  auVar288._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar378 = vmulsd_avx512f(auVar379,auVar288);
  dVar421 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4];
  auVar289._8_8_ = 0;
  auVar289._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar385 = vmulsd_avx512f(auVar379,auVar289);
  auVar290._8_8_ = 0;
  auVar290._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar386 = vmulsd_avx512f(auVar379,auVar290);
  dVar420 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7];
  auVar569._8_8_ = 0;
  auVar569._0_8_ = local_60;
  auVar546._8_8_ = 0;
  auVar546._0_8_ = local_78;
  auVar602._8_8_ = 0;
  auVar602._0_8_ =
       dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3] + auVar386._0_8_ + dVar421 + dVar421;
  auVar386 = vmulsd_avx512f(auVar602,auVar569);
  auVar603._8_8_ = 0;
  auVar603._0_8_ = local_48;
  auVar628._8_8_ = 0;
  auVar628._0_8_ =
       (dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[6] + auVar385._0_8_ + dVar420 + dVar420) * local_48;
  auVar385 = vaddsd_avx512f(auVar386,auVar628);
  dVar526 = (dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[0] + auVar378._0_8_ + dVar459 + dVar459) * local_78 +
            auVar385._0_8_ + dVar526;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar526;
  auVar379._8_8_ = 0;
  auVar379._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar378 = vmulsd_avx512f(auVar587,auVar379);
  auVar629._8_8_ = 0;
  auVar629._0_8_ =
       local_50 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vaddsd_avx512f(auVar629,auVar378);
  auVar291._8_8_ = 0;
  auVar291._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar385 = vmulsd_avx512f(auVar587,auVar291);
  auVar630._8_8_ = 0;
  auVar630._0_8_ =
       local_50 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar385 = vaddsd_avx512f(auVar630,auVar385);
  auVar292._8_8_ = 0;
  auVar292._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar386 = vmulsd_avx512f(auVar457,auVar292);
  auVar385 = vaddsd_avx512f(auVar386,auVar385);
  auVar617._8_8_ = 0;
  auVar617._0_8_ =
       local_68 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       + auVar378._0_8_;
  auVar378 = vmulsd_avx512f(auVar380,auVar617);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar526 + auVar378._0_8_ +
                 dVar2 * auVar385._0_8_ +
                 dVar1 * (local_68 *
                          (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[6] +
                         local_50 *
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[7] +
                         local_38 *
                         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8]);
  dVar459 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2];
  auVar293._8_8_ = 0;
  auVar293._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vmulsd_avx512f(auVar380,auVar293);
  auVar294._8_8_ = 0;
  auVar294._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar385 = vmulsd_avx512f(auVar382,auVar294);
  dVar421 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5];
  dVar420 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8];
  auVar295._8_8_ = 0;
  auVar295._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar386 = vmulsd_avx512f(auVar380,auVar295);
  auVar296._8_8_ = 0;
  auVar296._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar387 = vmulsd_avx512f(auVar382,auVar296);
  auVar297._8_8_ = 0;
  auVar297._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar389 = vmulsd_avx512f(auVar380,auVar297);
  auVar298._8_8_ = 0;
  auVar298._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar392 = vmulsd_avx512f(auVar382,auVar298);
  dVar526 = (auVar387._0_8_ + auVar386._0_8_ + dVar421 + dVar421) * local_58 +
            (auVar392._0_8_ + dVar420 + dVar420 + auVar389._0_8_) * local_40 +
            (auVar385._0_8_ + auVar378._0_8_ + dVar459 + dVar459) * local_70;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar526;
  auVar299._8_8_ = 0;
  auVar299._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar378 = vmulsd_avx512f(auVar603,auVar299);
  auVar631._8_8_ = 0;
  auVar631._0_8_ =
       local_60 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vaddsd_avx512f(auVar631,auVar378);
  auVar300._8_8_ = 0;
  auVar300._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar385 = vmulsd_avx512f(auVar603,auVar300);
  auVar632._8_8_ = 0;
  auVar632._0_8_ =
       local_60 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar385 = vaddsd_avx512f(auVar632,auVar385);
  auVar301._8_8_ = 0;
  auVar301._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar386 = vmulsd_avx512f(auVar546,auVar301);
  auVar385 = vaddsd_avx512f(auVar386,auVar385);
  auVar618._8_8_ = 0;
  auVar618._0_8_ =
       local_78 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       + auVar378._0_8_;
  auVar378 = vmulsd_avx512f(auVar380,auVar618);
  dVar526 = dVar526 + auVar378._0_8_ +
                      dVar2 * auVar385._0_8_ +
                      dVar1 * (local_78 *
                               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[6] +
                              local_48 *
                              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[8] +
                              local_60 *
                              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[7]);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar526;
  auVar302._8_8_ = 0;
  auVar302._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar378 = vmulsd_avx512f(auVar725,auVar302);
  auVar303._8_8_ = 0;
  auVar303._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar385 = vmulsd_avx512f(auVar725,auVar303);
  auVar304._8_8_ = 0;
  auVar304._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar386 = vmulsd_avx512f(auVar725,auVar304);
  dVar526 = dVar526 + (auVar378._0_8_ +
                      (dVar641 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[1] -
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] * 4.0)) * local_78 +
                      (auVar386._0_8_ +
                      (dVar641 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[7] -
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8] * 4.0)) * local_48 +
                      ((dVar641 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[4] -
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] * 4.0) + auVar385._0_8_) * local_60;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar526;
  dVar459 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  dVar421 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  dVar420 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6];
  dVar526 = dVar526 + ((dVar611 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[2] -
                       dVar1 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[1]) + dVar421 + dVar421) * local_70 +
                      (dVar459 + dVar459 +
                      (dVar611 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[5] -
                      dVar1 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[4])) * local_58 +
                      ((dVar611 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[8] -
                       dVar1 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[7]) + dVar420 + dVar420) * local_40;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar526;
  auVar604._8_8_ = 0;
  auVar604._0_8_ = local_38;
  auVar570._8_8_ = 0;
  auVar570._0_8_ = local_50;
  auVar378 = vxorpd_avx512vl(auVar604,auVar413);
  dVar459 = auVar378._0_8_;
  auVar522._8_8_ = 0;
  auVar522._0_8_ =
       (dVar459 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2] -
       local_50 *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
       ) - local_68 *
           (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
  auVar378 = vmulsd_avx512f(auVar380,auVar522);
  dVar526 = dVar526 + auVar378._0_8_ +
                      dVar2 * ((dVar459 * (xxF->
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          ).m_storage.m_data.array[5] -
                               local_50 *
                               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[4]) -
                              local_68 *
                              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[3]) +
                      dVar1 * ((dVar459 * (xxF->
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          ).m_storage.m_data.array[8] -
                               local_50 *
                               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[7]) -
                              local_68 *
                              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[6]);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar526;
  auVar305._8_8_ = 0;
  auVar305._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar378 = vmulsd_avx512f(auVar382,auVar305);
  dVar459 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  dVar421 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  auVar306._8_8_ = 0;
  auVar306._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar385 = vmulsd_avx512f(auVar382,auVar306);
  auVar307._8_8_ = 0;
  auVar307._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar386 = vmulsd_avx512f(auVar382,auVar307);
  dVar420 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6];
  auVar458._8_8_ = 0;
  auVar458._0_8_ = local_78;
  auVar494._8_8_ = 0;
  auVar494._0_8_ = local_60;
  auVar588._8_8_ = 0;
  auVar588._0_8_ =
       (auVar378._0_8_ +
       dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1]) - (dVar459 + dVar459);
  auVar378 = vmulsd_avx512f(auVar588,auVar458);
  auVar589._8_8_ = 0;
  auVar589._0_8_ = local_48;
  auVar619._8_8_ = 0;
  auVar619._0_8_ =
       ((auVar386._0_8_ +
        dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[4]) - (dVar421 + dVar421)) * local_60 +
       ((auVar385._0_8_ +
        dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[7]) - (dVar420 + dVar420)) * local_48;
  auVar378 = vaddsd_avx512f(auVar378,auVar619);
  dVar526 = auVar378._0_8_ + dVar526;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar526;
  auVar308._8_8_ = 0;
  auVar308._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar378 = vmulsd_avx512f(auVar604,auVar308);
  auVar309._8_8_ = 0;
  auVar309._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar385 = vmulsd_avx512f(auVar604,auVar309);
  auVar633._8_8_ = 0;
  auVar633._0_8_ =
       local_50 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vaddsd_avx512f(auVar633,auVar378);
  auVar310._8_8_ = 0;
  auVar310._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar386 = vmulsd_avx512f(auVar570,auVar310);
  auVar385 = vaddsd_avx512f(auVar386,auVar385);
  dVar459 = local_68 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6] +
            local_38 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8] +
            local_50 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7];
  auVar634._8_8_ = 0;
  auVar634._0_8_ =
       local_68 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar385 = vaddsd_avx512f(auVar634,auVar385);
  auVar620._8_8_ = 0;
  auVar620._0_8_ =
       local_68 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       + auVar378._0_8_;
  auVar378 = vmulsd_avx512f(auVar382,auVar620);
  auVar385 = vmulsd_avx512f(auVar380,auVar385);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar526 + auVar378._0_8_ + auVar385._0_8_ + dVar459 + dVar459;
  dVar459 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1];
  auVar382._8_8_ = 0;
  auVar382._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar378 = vmulsd_avx512f(auVar380,auVar382);
  auVar311._8_8_ = 0;
  auVar311._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar706._8_8_ = 0;
  auVar706._0_8_ = local_128;
  auVar385 = vmulsd_avx512f(auVar706,auVar311);
  dVar421 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4];
  auVar312._8_8_ = 0;
  auVar312._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar386 = vmulsd_avx512f(auVar380,auVar312);
  auVar313._8_8_ = 0;
  auVar313._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar387 = vmulsd_avx512f(auVar380,auVar313);
  auVar314._8_8_ = 0;
  auVar314._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar389 = vmulsd_avx512f(auVar706,auVar314);
  dVar420 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7];
  auVar315._8_8_ = 0;
  auVar315._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar707._8_8_ = 0;
  auVar707._0_8_ = local_128;
  auVar392 = vmulsd_avx512f(auVar707,auVar315);
  dVar421 = (auVar389._0_8_ + (auVar387._0_8_ - (dVar421 + dVar421))) * local_58 +
            (auVar392._0_8_ + (auVar386._0_8_ - (dVar420 + dVar420))) * local_40 +
            (auVar385._0_8_ + (auVar378._0_8_ - (dVar459 + dVar459))) * local_70;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar421;
  auVar316._8_8_ = 0;
  auVar316._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar378 = vmulsd_avx512f(auVar589,auVar316);
  auVar317._8_8_ = 0;
  auVar317._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar385 = vmulsd_avx512f(auVar589,auVar317);
  auVar635._8_8_ = 0;
  auVar635._0_8_ =
       local_60 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vaddsd_avx512f(auVar635,auVar378);
  auVar318._8_8_ = 0;
  auVar318._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar386 = vmulsd_avx512f(auVar494,auVar318);
  dVar459 = local_78 *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0] + auVar378._0_8_;
  auVar378 = vaddsd_avx512f(auVar386,auVar385);
  auVar636._8_8_ = 0;
  auVar636._0_8_ =
       local_78 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar378 = vaddsd_avx512f(auVar636,auVar378);
  auVar378 = vmulsd_avx512f(auVar707,auVar378);
  dVar421 = dVar421 + dVar459 + dVar459 +
                      auVar378._0_8_ +
                      dVar2 * (local_78 *
                               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[6] +
                              local_60 *
                              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[7] +
                              local_48 *
                              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[8]);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar421;
  dVar421 = dVar421 + (dVar406 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] * 4.0 +
                      dVar641 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2]) * local_78 +
                      (dVar406 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[3] +
                      dVar641 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5] +
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4] * 4.0) * local_60 +
                      ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7] * 4.0 +
                       dVar641 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[8] +
                      dVar406 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[6]) * local_48;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar421;
  auVar319._8_8_ = 0;
  auVar319._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar378 = vmulsd_avx512f(auVar380,auVar319);
  auVar320._8_8_ = 0;
  auVar320._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar385 = vmulsd_avx512f(auVar380,auVar320);
  auVar321._8_8_ = 0;
  auVar321._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar386 = vmulsd_avx512f(auVar380,auVar321);
  dVar421 = dVar421 + ((dVar405 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[2] -
                       dVar2 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[1]) - auVar378._0_8_) * local_70 +
                      ((dVar405 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[5] -
                       dVar2 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[4]) - auVar385._0_8_) * local_58 +
                      local_40 *
                      ((dVar405 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[8] -
                       dVar2 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[7]) - auVar386._0_8_);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar421;
  auVar547._8_8_ = 0;
  auVar547._0_8_ = local_38;
  auVar378 = vxorpd_avx512vl(auVar547,auVar413);
  dVar420 = auVar378._0_8_;
  dVar459 = (dVar420 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[2] -
            local_50 *
            (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1]) -
            local_68 *
            (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  auVar605._8_8_ = 0;
  auVar605._0_8_ =
       (dVar420 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] -
       local_50 *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
       ) - local_68 *
           (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[3];
  auVar378 = vmulsd_avx512f(auVar707,auVar605);
  dVar421 = dVar421 + dVar459 + dVar459 +
                      auVar378._0_8_ +
                      dVar2 * ((dVar420 * (xxF->
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          ).m_storage.m_data.array[8] -
                               local_50 *
                               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[7]) -
                              local_68 *
                              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[6]);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar421;
  auVar322._8_8_ = 0;
  auVar322._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar378 = vmulsd_avx512f(auVar380,auVar322);
  auVar323._8_8_ = 0;
  auVar323._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar385 = vmulsd_avx512f(auVar380,auVar323);
  auVar324._8_8_ = 0;
  auVar324._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar386 = vmulsd_avx512f(auVar380,auVar324);
  auVar590._8_8_ = 0;
  auVar590._0_8_ =
       dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
       dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5] + auVar385._0_8_;
  auVar662._8_8_ = 0;
  auVar662._0_8_ = local_60;
  auVar385 = vmulsd_avx512f(auVar590,auVar662);
  auVar387 = vmulsd_avx512f(auVar662,auVar403);
  auVar606._8_8_ = 0;
  auVar606._0_8_ = local_78;
  auVar621._8_8_ = 0;
  auVar621._0_8_ =
       auVar386._0_8_ +
       dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
       dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8];
  auVar670._8_8_ = 0;
  auVar670._0_8_ = local_48;
  auVar386 = vmulsd_avx512f(auVar621,auVar670);
  auVar394 = ZEXT816(0xc000000000000000);
  auVar389 = vmulsd_avx512f(auVar670,auVar394);
  auVar392 = vmulsd_avx512f(auVar606,auVar394);
  dVar421 = dVar421 + local_78 *
                      (auVar378._0_8_ +
                      dVar1 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[2] +
                      dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[1]) + auVar386._0_8_ + auVar385._0_8_;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar421;
  dVar459 = local_50 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4] +
            local_38 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5] +
            local_68 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  auVar571._8_8_ = 0;
  auVar571._0_8_ =
       local_68 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       + local_38 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [2] + local_50 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1];
  auVar378 = vmulsd_avx512f(auVar707,auVar571);
  auVar495._8_8_ = 0;
  auVar495._0_8_ =
       local_68 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       + local_50 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] + local_38 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8];
  auVar385 = vmulsd_avx512f(auVar380,auVar495);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar421 + auVar378._0_8_ + (auVar385._0_8_ - (dVar459 + dVar459));
  auVar637._8_8_ = 0;
  auVar637._0_8_ = local_58;
  dVar459 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2];
  auVar496._8_8_ = 0;
  auVar496._0_8_ = dVar459;
  auVar523._8_8_ = 0;
  auVar523._0_8_ = local_70;
  dVar421 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  auVar650._8_8_ = 0;
  auVar650._0_8_ = local_40;
  auVar378 = vmulsd_avx512f(auVar650,auVar496);
  auVar548._8_8_ = 0;
  auVar548._0_8_ =
       local_70 *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar572._8_8_ = 0;
  auVar572._0_8_ =
       local_58 *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
       + auVar378._0_8_;
  auVar378 = vaddsd_avx512f(auVar548,auVar572);
  dVar420 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4];
  auVar549._8_8_ = 0;
  auVar549._0_8_ = dVar420;
  dVar526 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5];
  auVar573._8_8_ = 0;
  auVar573._0_8_ = dVar526;
  auVar378 = vmulsd_avx512f(auVar523,auVar378);
  auVar385 = vmulsd_avx512f(auVar650,auVar573);
  auVar622._8_8_ = 0;
  auVar622._0_8_ = local_58 * dVar420;
  auVar385 = vaddsd_avx512f(auVar622,auVar385);
  auVar591._8_8_ = 0;
  auVar591._0_8_ = local_70 * dVar421;
  auVar385 = vaddsd_avx512f(auVar591,auVar385);
  auVar592._8_8_ = 0;
  auVar592._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  dVar420 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8];
  auVar623._8_8_ = 0;
  auVar623._0_8_ = dVar420;
  auVar385 = vmulsd_avx512f(auVar637,auVar385);
  auVar386 = vmulsd_avx512f(auVar637,auVar592);
  auVar651._8_8_ = 0;
  auVar651._0_8_ = local_40;
  auVar395 = vmulsd_avx512f(auVar651,auVar623);
  auVar386 = vaddsd_avx512f(auVar386,auVar395);
  auVar657._8_8_ = 0;
  auVar657._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar395 = vmulsd_avx512f(auVar523,auVar657);
  auVar386 = vaddsd_avx512f(auVar395,auVar386);
  auVar325._8_8_ = 0;
  auVar325._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar395 = vmulsd_avx512f(auVar389,auVar325);
  auVar386 = vmulsd_avx512f(auVar651,auVar386);
  auVar385 = vaddsd_avx512f(auVar385,auVar386);
  auVar326._8_8_ = 0;
  auVar326._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar386 = vmulsd_avx512f(auVar389,auVar326);
  auVar327._8_8_ = 0;
  auVar327._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar389 = vmulsd_avx512f(auVar389,auVar327);
  auVar378 = vaddsd_avx512f(auVar378,auVar385);
  auVar328._8_8_ = 0;
  auVar328._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar385 = vmulsd_avx512f(auVar387,auVar328);
  auVar385 = vaddsd_avx512f(auVar385,auVar386);
  auVar329._8_8_ = 0;
  auVar329._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar386 = vmulsd_avx512f(auVar392,auVar329);
  auVar385 = vaddsd_avx512f(auVar386,auVar385);
  auVar330._8_8_ = 0;
  auVar330._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar386 = vmulsd_avx512f(auVar387,auVar330);
  auVar331._8_8_ = 0;
  auVar331._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar387 = vmulsd_avx512f(auVar387,auVar331);
  auVar385 = vmulsd_avx512f(auVar385,auVar523);
  auVar386 = vaddsd_avx512f(auVar386,auVar395);
  auVar332._8_8_ = 0;
  auVar332._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar395 = vmulsd_avx512f(auVar392,auVar332);
  auVar387 = vaddsd_avx512f(auVar387,auVar389);
  auVar333._8_8_ = 0;
  auVar333._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar671._8_8_ = 0;
  auVar671._0_8_ = local_48;
  auVar389 = vmulsd_avx512f(auVar671,auVar333);
  auVar607._8_8_ = 0;
  auVar607._0_8_ =
       auVar392._0_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar387 = vaddsd_avx512f(auVar607,auVar387);
  auVar386 = vaddsd_avx512f(auVar395,auVar386);
  auVar608._8_8_ = 0;
  auVar608._0_8_ = local_78;
  auVar386 = vmulsd_avx512f(auVar386,auVar637);
  auVar387 = vmulsd_avx512f(auVar387,auVar651);
  auVar334._8_8_ = 0;
  auVar334._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar392 = vmulsd_avx512f(auVar608,auVar334);
  auVar386 = vaddsd_avx512f(auVar386,auVar387);
  auVar335._8_8_ = 0;
  auVar335._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar663._8_8_ = 0;
  auVar663._0_8_ = local_60;
  auVar387 = vmulsd_avx512f(auVar663,auVar335);
  auVar524._8_8_ = 0;
  auVar524._0_8_ = auVar386._0_8_ + auVar385._0_8_;
  auVar378 = vaddsd_avx512f(auVar378,auVar524);
  auVar336._8_8_ = 0;
  auVar336._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar385 = vmulsd_avx512f(auVar671,auVar336);
  auVar385 = vaddsd_avx512f(auVar387,auVar385);
  auVar337._8_8_ = 0;
  auVar337._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar672._8_8_ = 0;
  auVar672._0_8_ = local_48;
  auVar386 = vmulsd_avx512f(auVar672,auVar337);
  auVar638._8_8_ = 0;
  auVar638._0_8_ =
       local_78 *
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar385 = vaddsd_avx512f(auVar638,auVar385);
  auVar338._8_8_ = 0;
  auVar338._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar387 = vmulsd_avx512f(auVar663,auVar338);
  auVar386 = vaddsd_avx512f(auVar387,auVar386);
  auVar339._8_8_ = 0;
  auVar339._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar387 = vmulsd_avx512f(auVar608,auVar339);
  auVar386 = vaddsd_avx512f(auVar387,auVar386);
  auVar340._8_8_ = 0;
  auVar340._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar664._8_8_ = 0;
  auVar664._0_8_ = local_60;
  auVar387 = vmulsd_avx512f(auVar664,auVar340);
  auVar386 = vmulsd_avx512f(auVar664,auVar386);
  auVar387 = vaddsd_avx512f(auVar387,auVar389);
  auVar387 = vaddsd_avx512f(auVar392,auVar387);
  auVar387 = vmulsd_avx512f(auVar672,auVar387);
  auVar386 = vaddsd_avx512f(auVar386,auVar387);
  auVar639._8_8_ = 0;
  auVar639._0_8_ = local_78 * auVar385._0_8_;
  auVar385 = vaddsd_avx512f(auVar639,auVar386);
  auVar640._8_8_ = 0;
  auVar640._0_8_ = dVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] = auVar385._0_8_ + auVar378._0_8_;
  auVar341._8_8_ = 0;
  auVar341._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar652._8_8_ = 0;
  auVar652._0_8_ = dVar497;
  auVar378 = vmulsd_avx512f(auVar652,auVar341);
  auVar385 = vmulsd_avx512f(auVar652,auVar549);
  auVar653._8_8_ = 0;
  auVar653._0_8_ = dVar497;
  auVar386 = vmulsd_avx512f(auVar653,auVar592);
  auVar387 = vmulsd_avx512f(auVar640,auVar657);
  dVar421 = (dVar4 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[0] + (auVar378._0_8_ - dVar459 * 4.0)) * local_70 +
            (dVar4 * dVar421 + (auVar385._0_8_ - dVar526 * 4.0)) * local_58 +
            (auVar387._0_8_ + (auVar386._0_8_ - dVar420 * 4.0)) * local_40;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       dVar421;
  auVar342._8_8_ = 0;
  auVar342._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vmulsd_avx512f(auVar655,auVar342);
  auVar343._8_8_ = 0;
  auVar343._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar385 = vmulsd_avx512f(auVar655,auVar343);
  auVar344._8_8_ = 0;
  auVar344._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar386 = vmulsd_avx512f(auVar655,auVar344);
  auVar387 = vmulsd_avx512f(auVar672,auVar394);
  auVar389 = vmulsd_avx512f(auVar664,auVar394);
  dVar421 = dVar421 + (dVar641 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      dVar644 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2] + auVar378._0_8_) * local_70 +
                      (dVar641 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[3] +
                      dVar644 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5] + auVar385._0_8_) * local_58 +
                      (dVar641 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      auVar386._0_8_ +
                      dVar644 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8]) * local_40;
  auVar378 = vmulsd_avx512f(auVar608,auVar394);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       dVar421;
  dVar526 = auVar389._0_8_;
  dVar405 = auVar387._0_8_;
  dVar420 = auVar378._0_8_;
  dVar459 = dVar420 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[6] +
            dVar526 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
            dVar405 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8];
  dVar421 = dVar421 + dVar2 * (dVar420 * (xyF->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         ).m_storage.m_data.array[0] +
                              dVar405 * (xyF->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        ).m_storage.m_data.array[2] +
                              dVar526 * (xyF->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        ).m_storage.m_data.array[1]) +
                      ((dVar526 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[4] +
                        dVar405 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[5] +
                       dVar420 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[3]) * dVar610 - (dVar459 + dVar459));
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       dVar421;
  auVar345._8_8_ = 0;
  auVar345._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vmulsd_avx512f(auVar640,auVar345);
  auVar346._8_8_ = 0;
  auVar346._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar385 = vmulsd_avx512f(auVar388,auVar346);
  auVar609._8_8_ = 0;
  auVar609._0_8_ = local_48;
  auVar347._8_8_ = 0;
  auVar347._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar386 = vmulsd_avx512f(auVar640,auVar347);
  auVar348._8_8_ = 0;
  auVar348._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar387 = vmulsd_avx512f(auVar388,auVar348);
  auVar349._8_8_ = 0;
  auVar349._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar389 = vmulsd_avx512f(auVar640,auVar349);
  auVar350._8_8_ = 0;
  auVar350._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar392 = vmulsd_avx512f(auVar388,auVar350);
  auVar593._8_8_ = 0;
  auVar593._0_8_ = local_60;
  auVar574._8_8_ = 0;
  auVar574._0_8_ = local_78;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       dVar421 + (auVar385._0_8_ +
                 auVar378._0_8_ +
                 dVar377 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[2]) * local_78 +
                 (auVar387._0_8_ +
                 auVar386._0_8_ +
                 dVar377 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[5]) * local_60 +
                 local_48 *
                 (auVar392._0_8_ +
                 auVar389._0_8_ +
                 dVar377 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[8]);
  auVar351._8_8_ = 0;
  auVar351._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vmulsd_avx512f(auVar640,auVar351);
  auVar352._8_8_ = 0;
  auVar352._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar385 = vmulsd_avx512f(auVar388,auVar352);
  auVar353._8_8_ = 0;
  auVar353._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar386 = vmulsd_avx512f(auVar640,auVar353);
  auVar354._8_8_ = 0;
  auVar354._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar387 = vmulsd_avx512f(auVar388,auVar354);
  auVar355._8_8_ = 0;
  auVar355._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar389 = vmulsd_avx512f(auVar640,auVar355);
  auVar356._8_8_ = 0;
  auVar356._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar392 = vmulsd_avx512f(auVar388,auVar356);
  dVar459 = (auVar385._0_8_ +
            auVar378._0_8_ +
            dVar377 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2]) * local_70 +
            local_58 *
            (auVar387._0_8_ +
            auVar386._0_8_ +
            dVar377 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5]) +
            local_40 *
            (auVar392._0_8_ +
            dVar377 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8] + auVar389._0_8_);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       dVar459;
  auVar357._8_8_ = 0;
  auVar357._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar726._8_8_ = 0;
  auVar726._0_8_ = dVar499;
  auVar378 = vmulsd_avx512f(auVar726,auVar357);
  auVar358._8_8_ = 0;
  auVar358._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar385 = vmulsd_avx512f(auVar726,auVar358);
  auVar359._8_8_ = 0;
  auVar359._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar386 = vmulsd_avx512f(auVar726,auVar359);
  auVar648._8_8_ = 0;
  auVar648._0_8_ =
       dVar641 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] -
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
       * 4.0;
  auVar385 = vaddsd_avx512f(auVar385,auVar648);
  auVar387 = vmulsd_avx512f(auVar593,auVar394);
  auVar389 = vmulsd_avx512f(auVar609,auVar394);
  dVar459 = dVar459 + (auVar378._0_8_ +
                      (dVar641 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[1] -
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] * 4.0)) * local_70 +
                      local_58 *
                      ((dVar641 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[4] -
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] * 4.0) + auVar386._0_8_) + auVar385._0_8_ * local_40;
  auVar378 = vmulsd_avx512f(auVar574,auVar394);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       dVar459;
  dVar420 = auVar387._0_8_;
  dVar526 = auVar389._0_8_;
  dVar421 = auVar378._0_8_;
  auVar525._8_8_ = 0;
  auVar525._0_8_ =
       dVar421 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0] +
       dVar526 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2] +
       dVar420 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1];
  auVar378 = vmulsd_avx512f(auVar380,auVar525);
  dVar459 = dVar459 + auVar378._0_8_ +
                      dVar2 * (dVar421 * (xyF->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         ).m_storage.m_data.array[3] +
                              dVar526 * (xyF->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        ).m_storage.m_data.array[5] +
                              dVar420 * (xyF->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        ).m_storage.m_data.array[4]) +
                      dVar1 * (dVar421 * (xyF->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         ).m_storage.m_data.array[6] +
                              dVar420 * (xyF->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        ).m_storage.m_data.array[7] +
                              dVar526 * (xyF->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        ).m_storage.m_data.array[8]);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       dVar459;
  auVar380._8_8_ = 0;
  auVar380._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vmulsd_avx512f(auVar388,auVar380);
  auVar360._8_8_ = 0;
  auVar360._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar720._8_8_ = 0;
  auVar720._0_8_ = dVar498;
  auVar385 = vmulsd_avx512f(auVar720,auVar360);
  auVar594._8_8_ = 0;
  auVar594._0_8_ = local_48;
  auVar361._8_8_ = 0;
  auVar361._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar386 = vmulsd_avx512f(auVar388,auVar361);
  auVar362._8_8_ = 0;
  auVar362._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar387 = vmulsd_avx512f(auVar720,auVar362);
  auVar363._8_8_ = 0;
  auVar363._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar389 = vmulsd_avx512f(auVar388,auVar363);
  auVar364._8_8_ = 0;
  auVar364._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar392 = vmulsd_avx512f(auVar720,auVar364);
  auVar575._8_8_ = 0;
  auVar575._0_8_ = local_60;
  auVar552._8_8_ = 0;
  auVar552._0_8_ = local_78;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       dVar459 + (auVar385._0_8_ +
                 auVar378._0_8_ +
                 (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2] * 4.0) * local_78 +
                 (auVar387._0_8_ +
                 auVar386._0_8_ +
                 (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5] * 4.0) * local_60 +
                 (auVar392._0_8_ +
                 auVar389._0_8_ +
                 (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8] * 4.0) * local_48;
  auVar365._8_8_ = 0;
  auVar365._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar378 = vmulsd_avx512f(auVar722,auVar365);
  auVar366._8_8_ = 0;
  auVar366._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar385 = vmulsd_avx512f(auVar640,auVar366);
  auVar367._8_8_ = 0;
  auVar367._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar386 = vmulsd_avx512f(auVar640,auVar367);
  auVar368._8_8_ = 0;
  auVar368._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar387 = vmulsd_avx512f(auVar640,auVar368);
  auVar369._8_8_ = 0;
  auVar369._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar389 = vmulsd_avx512f(auVar722,auVar369);
  auVar370._8_8_ = 0;
  auVar370._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar392 = vmulsd_avx512f(auVar722,auVar370);
  dVar459 = ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[0] * 4.0 + auVar378._0_8_ + auVar385._0_8_) * local_70 +
            local_58 *
            ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3] * 4.0 + auVar389._0_8_ + auVar386._0_8_) +
            local_40 *
            ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6] * 4.0 + auVar387._0_8_ + auVar392._0_8_);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       dVar459;
  auVar378 = vmulsd_avx512f(auVar575,auVar394);
  dVar459 = dVar459 + (dVar406 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      dVar641 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2] +
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] * 4.0) * local_70 +
                      local_58 *
                      (dVar406 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[3] +
                      dVar641 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5] +
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4] * 4.0) +
                      local_40 *
                      ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7] * 4.0 +
                       dVar641 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[8] +
                      dVar406 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[6]);
  auVar385 = vmulsd_avx512f(auVar552,auVar394);
  auVar386 = vmulsd_avx512f(auVar594,auVar394);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       dVar459;
  dVar420 = auVar378._0_8_;
  dVar526 = auVar386._0_8_;
  dVar421 = auVar385._0_8_;
  dVar1 = dVar421 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[0] +
          dVar420 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[1] +
          dVar526 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2];
  auVar550._8_8_ = 0;
  auVar550._0_8_ =
       dVar421 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3] +
       dVar420 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4] +
       dVar526 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5];
  auVar708._8_8_ = 0;
  auVar708._0_8_ = local_128;
  auVar378 = vmulsd_avx512f(auVar708,auVar550);
  dVar459 = dVar459 + dVar1 + dVar1 +
                      auVar378._0_8_ +
                      dVar2 * (dVar421 * (xyF->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         ).m_storage.m_data.array[6] +
                              dVar420 * (xyF->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        ).m_storage.m_data.array[7] +
                              dVar526 * (xyF->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        ).m_storage.m_data.array[8]);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       dVar459;
  auVar371._8_8_ = 0;
  auVar371._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar378 = vmulsd_avx512f(auVar388,auVar371);
  auVar372._8_8_ = 0;
  auVar372._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar723._8_8_ = 0;
  auVar723._0_8_ = dVar501;
  auVar385 = vmulsd_avx512f(auVar723,auVar372);
  auVar373._8_8_ = 0;
  auVar373._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar386 = vmulsd_avx512f(auVar388,auVar373);
  auVar374._8_8_ = 0;
  auVar374._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar387 = vmulsd_avx512f(auVar723,auVar374);
  auVar375._8_8_ = 0;
  auVar375._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar388 = vmulsd_avx512f(auVar388,auVar375);
  auVar376._8_8_ = 0;
  auVar376._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar389 = vmulsd_avx512f(auVar723,auVar376);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       dVar459 + (auVar385._0_8_ +
                 (auVar378._0_8_ -
                 (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] * 4.0)) * local_78 +
                 (auVar389._0_8_ +
                 (auVar388._0_8_ -
                 (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4] * 4.0)) * local_60 +
                 (auVar387._0_8_ +
                 (auVar386._0_8_ -
                 (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] * 4.0)) * local_48;
  dVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
          m_storage.m_data.array[6];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[1] =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[3];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[2] = dVar1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[5] =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[7];
  dVar1 = (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[6];
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       dVar1;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  dVar1 = (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[6];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       dVar1;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  dVar1 = (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[6];
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       dVar1;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d
opengv::relative_pose::modules::eigensolver::composeMwithJacobians(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const cayley_t & cayley,
    Eigen::Matrix3d & M_jac1,
    Eigen::Matrix3d & M_jac2,
    Eigen::Matrix3d & M_jac3 )
{
  rotation_t R = math::cayley2rot_reduced(cayley);
  rotation_t R_jac1;
  rotation_t R_jac2;
  rotation_t R_jac3;

  R_jac1(0,0) = 2*cayley[0];
  R_jac1(0,1) = 2*cayley[1];
  R_jac1(0,2) = 2*cayley[2];
  R_jac1(1,0) = 2*cayley[1];
  R_jac1(1,1) = -2*cayley[0];
  R_jac1(1,2) = -2;
  R_jac1(2,0) = 2*cayley[2];
  R_jac1(2,1) = 2;
  R_jac1(2,2) = -2*cayley[0];
  R_jac2(0,0) = -2*cayley[1];
  R_jac2(0,1) = 2*cayley[0];
  R_jac2(0,2) = 2;
  R_jac2(1,0) = 2*cayley[0];
  R_jac2(1,1) = 2*cayley[1];
  R_jac2(1,2) = 2*cayley[2];
  R_jac2(2,0) = -2;
  R_jac2(2,1) = 2*cayley[2];
  R_jac2(2,2) = -2*cayley[1];
  R_jac3(0,0) = -2*cayley[2];
  R_jac3(0,1) = -2;
  R_jac3(0,2) = 2*cayley[0];
  R_jac3(1,0) = 2;
  R_jac3(1,1) = -2*cayley[2];
  R_jac3(1,2) = 2*cayley[1];
  R_jac3(2,0) = 2*cayley[0];
  R_jac3(2,1) = 2*cayley[1];
  R_jac3(2,2) = 2*cayley[2];

  //Fill the matrix M using the precomputed summation terms. Plus Jacobian.
  Eigen::Matrix3d M;
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  M(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  M(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  M(0,0) += temp;
  temp = 2.0*R_jac1.row(2)*yyF*R.row(2).transpose();
  M_jac1(0,0)  = temp;
  temp = -2.0*R_jac1.row(2)*yzF*R.row(1).transpose();
  M_jac1(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac1.row(1).transpose();
  M_jac1(0,0) += temp;
  temp = 2.0*R_jac1.row(1)*zzF*R.row(1).transpose();
  M_jac1(0,0) += temp;
  temp = 2.0*R_jac2.row(2)*yyF*R.row(2).transpose();
  M_jac2(0,0)  = temp;
  temp = -2.0*R_jac2.row(2)*yzF*R.row(1).transpose();
  M_jac2(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac2.row(1).transpose();
  M_jac2(0,0) += temp;
  temp = 2.0*R_jac2.row(1)*zzF*R.row(1).transpose();
  M_jac2(0,0) += temp;
  temp = 2.0*R_jac3.row(2)*yyF*R.row(2).transpose();
  M_jac3(0,0)  = temp;
  temp = -2.0*R_jac3.row(2)*yzF*R.row(1).transpose();
  M_jac3(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac3.row(1).transpose();
  M_jac3(0,0) += temp;
  temp = 2.0*R_jac3.row(1)*zzF*R.row(1).transpose();
  M_jac3(0,0) += temp;

  temp =      R.row(2)*yzF*R.row(0).transpose();
  M(0,1)  = temp;
  temp = -1.0*R.row(2)*xyF*R.row(2).transpose();
  M(0,1) += temp;
  temp = -1.0*R.row(1)*zzF*R.row(0).transpose();
  M(0,1) += temp;
  temp =      R.row(1)*zxF*R.row(2).transpose();
  M(0,1) += temp;
  temp = R_jac1.row(2)*yzF*R.row(0).transpose();
  M_jac1(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac1.row(0).transpose();
  M_jac1(0,1) += temp;
  temp = -2.0*R_jac1.row(2)*xyF*R.row(2).transpose();
  M_jac1(0,1) += temp;
  temp = -R_jac1.row(1)*zzF*R.row(0).transpose();
  M_jac1(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac1.row(0).transpose();
  M_jac1(0,1) += temp;
  temp = R_jac1.row(1)*zxF*R.row(2).transpose();
  M_jac1(0,1) += temp;
  temp = R.row(1)*zxF*R_jac1.row(2).transpose();
  M_jac1(0,1) += temp;
  temp = R_jac2.row(2)*yzF*R.row(0).transpose();
  M_jac2(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac2.row(0).transpose();
  M_jac2(0,1) += temp;
  temp = -2.0*R_jac2.row(2)*xyF*R.row(2).transpose();
  M_jac2(0,1) += temp;
  temp = -R_jac2.row(1)*zzF*R.row(0).transpose();
  M_jac2(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac2.row(0).transpose();
  M_jac2(0,1) += temp;
  temp = R_jac2.row(1)*zxF*R.row(2).transpose();
  M_jac2(0,1) += temp;
  temp = R.row(1)*zxF*R_jac2.row(2).transpose();
  M_jac2(0,1) += temp;
  temp = R_jac3.row(2)*yzF*R.row(0).transpose();
  M_jac3(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac3.row(0).transpose();
  M_jac3(0,1) += temp;
  temp = -2.0*R_jac3.row(2)*xyF*R.row(2).transpose();
  M_jac3(0,1) += temp;
  temp = -R_jac3.row(1)*zzF*R.row(0).transpose();
  M_jac3(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac3.row(0).transpose();
  M_jac3(0,1) += temp;
  temp = R_jac3.row(1)*zxF*R.row(2).transpose();
  M_jac3(0,1) += temp;
  temp = R.row(1)*zxF*R_jac3.row(2).transpose();
  M_jac3(0,1) += temp;

  temp =      R.row(2)*xyF*R.row(1).transpose();
  M(0,2)  = temp;
  temp = -1.0*R.row(2)*yyF*R.row(0).transpose();
  M(0,2) += temp;
  temp = -1.0*R.row(1)*zxF*R.row(1).transpose();
  M(0,2) += temp;
  temp =      R.row(1)*yzF*R.row(0).transpose();
  M(0,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(1).transpose();
  M_jac1(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac1.row(1).transpose();
  M_jac1(0,2) += temp;
  temp = -R_jac1.row(2)*yyF*R.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac1.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = -2.0*R_jac1.row(1)*zxF*R.row(1).transpose();
  M_jac1(0,2) += temp;
  temp = R_jac1.row(1)*yzF*R.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = R.row(1)*yzF*R_jac1.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(1).transpose();
  M_jac2(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac2.row(1).transpose();
  M_jac2(0,2) += temp;
  temp = -R_jac2.row(2)*yyF*R.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac2.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = -2.0*R_jac2.row(1)*zxF*R.row(1).transpose();
  M_jac2(0,2) += temp;
  temp = R_jac2.row(1)*yzF*R.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = R.row(1)*yzF*R_jac2.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(1).transpose();
  M_jac3(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac3.row(1).transpose();
  M_jac3(0,2) += temp;
  temp = -R_jac3.row(2)*yyF*R.row(0).transpose();
  M_jac3(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac3.row(0).transpose();
  M_jac3(0,2) += temp;
  temp = -2.0*R_jac3.row(1)*zxF*R.row(1).transpose();
  M_jac3(0,2) += temp;
  temp = R_jac3.row(1)*yzF*R.row(0).transpose();
  M_jac3(0,2) += temp;
  temp = R.row(1)*yzF*R_jac3.row(0).transpose();
  M_jac3(0,2) += temp;

  temp =      R.row(0)*zzF*R.row(0).transpose();
  M(1,1)  = temp;
  temp = -2.0*R.row(0)*zxF*R.row(2).transpose();
  M(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  M(1,1) += temp;
  temp = 2.0*R_jac1.row(0)*zzF*R.row(0).transpose();
  M_jac1(1,1)  = temp;
  temp = -2.0*R_jac1.row(0)*zxF*R.row(2).transpose();
  M_jac1(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac1.row(2).transpose();
  M_jac1(1,1) += temp;
  temp = 2.0*R_jac1.row(2)*xxF*R.row(2).transpose();
  M_jac1(1,1) += temp;
  temp = 2.0*R_jac2.row(0)*zzF*R.row(0).transpose();
  M_jac2(1,1)  = temp;
  temp = -2.0*R_jac2.row(0)*zxF*R.row(2).transpose();
  M_jac2(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac2.row(2).transpose();
  M_jac2(1,1) += temp;
  temp = 2.0*R_jac2.row(2)*xxF*R.row(2).transpose();
  M_jac2(1,1) += temp;
  temp = 2.0*R_jac3.row(0)*zzF*R.row(0).transpose();
  M_jac3(1,1)  = temp;
  temp = -2.0*R_jac3.row(0)*zxF*R.row(2).transpose();
  M_jac3(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac3.row(2).transpose();
  M_jac3(1,1) += temp;
  temp = 2.0*R_jac3.row(2)*xxF*R.row(2).transpose();
  M_jac3(1,1) += temp;

  temp =      R.row(0)*zxF*R.row(1).transpose();
  M(1,2)  = temp;
  temp = -1.0*R.row(0)*yzF*R.row(0).transpose();
  M(1,2) += temp;
  temp = -1.0*R.row(2)*xxF*R.row(1).transpose();
  M(1,2) += temp;
  temp =      R.row(2)*xyF*R.row(0).transpose();
  M(1,2) += temp;
  temp = R_jac1.row(0)*zxF*R.row(1).transpose();
  M_jac1(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac1.row(1).transpose();
  M_jac1(1,2) += temp;
  temp = -2.0*R_jac1.row(0)*yzF*R.row(0).transpose();
  M_jac1(1,2) += temp;
  temp = -R_jac1.row(2)*xxF*R.row(1).transpose();
  M_jac1(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac1.row(1).transpose();
  M_jac1(1,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(0).transpose();
  M_jac1(1,2) += temp;
  temp = R.row(2)*xyF*R_jac1.row(0).transpose();
  M_jac1(1,2) += temp;
  temp = R_jac2.row(0)*zxF*R.row(1).transpose();
  M_jac2(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac2.row(1).transpose();
  M_jac2(1,2) += temp;
  temp = -2.0*R_jac2.row(0)*yzF*R.row(0).transpose();
  M_jac2(1,2) += temp;
  temp = -R_jac2.row(2)*xxF*R.row(1).transpose();
  M_jac2(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac2.row(1).transpose();
  M_jac2(1,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(0).transpose();
  M_jac2(1,2) += temp;
  temp = R.row(2)*xyF*R_jac2.row(0).transpose();
  M_jac2(1,2) += temp;
  temp = R_jac3.row(0)*zxF*R.row(1).transpose();
  M_jac3(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac3.row(1).transpose();
  M_jac3(1,2) += temp;
  temp = -2.0*R_jac3.row(0)*yzF*R.row(0).transpose();
  M_jac3(1,2) += temp;
  temp = -R_jac3.row(2)*xxF*R.row(1).transpose();
  M_jac3(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac3.row(1).transpose();
  M_jac3(1,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(0).transpose();
  M_jac3(1,2) += temp;
  temp = R.row(2)*xyF*R_jac3.row(0).transpose();
  M_jac3(1,2) += temp;

  temp =      R.row(1)*xxF*R.row(1).transpose();
  M(2,2)  = temp;
  temp = -2.0*R.row(0)*xyF*R.row(1).transpose();
  M(2,2) += temp;
  temp =      R.row(0)*yyF*R.row(0).transpose();
  M(2,2) += temp;
  temp = 2.0*R_jac1.row(1)*xxF*R.row(1).transpose();
  M_jac1(2,2)  = temp;
  temp = -2.0*R_jac1.row(0)*xyF*R.row(1).transpose();
  M_jac1(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac1.row(1).transpose();
  M_jac1(2,2) += temp;
  temp = 2.0*R_jac1.row(0)*yyF*R.row(0).transpose();
  M_jac1(2,2) += temp;
  temp = 2.0*R_jac2.row(1)*xxF*R.row(1).transpose();
  M_jac2(2,2)  = temp;
  temp = -2.0*R_jac2.row(0)*xyF*R.row(1).transpose();
  M_jac2(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac2.row(1).transpose();
  M_jac2(2,2) += temp;
  temp = 2.0*R_jac2.row(0)*yyF*R.row(0).transpose();
  M_jac2(2,2) += temp;
  temp = 2.0*R_jac3.row(1)*xxF*R.row(1).transpose();
  M_jac3(2,2)  = temp;
  temp = -2.0*R_jac3.row(0)*xyF*R.row(1).transpose();
  M_jac3(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac3.row(1).transpose();
  M_jac3(2,2) += temp;
  temp = 2.0*R_jac3.row(0)*yyF*R.row(0).transpose();
  M_jac3(2,2) += temp;

  M(1,0) = M(0,1);
  M(2,0) = M(0,2);
  M(2,1) = M(1,2);
  M_jac1(1,0) = M_jac1(0,1);
  M_jac1(2,0) = M_jac1(0,2);
  M_jac1(2,1) = M_jac1(1,2);
  M_jac2(1,0) = M_jac2(0,1);
  M_jac2(2,0) = M_jac2(0,2);
  M_jac2(2,1) = M_jac2(1,2);
  M_jac3(1,0) = M_jac3(0,1);
  M_jac3(2,0) = M_jac3(0,2);
  M_jac3(2,1) = M_jac3(1,2);

  return M;
}